

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_log>(Mat *a,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [48];
  undefined1 auVar97 [24];
  undefined1 auVar98 [40];
  undefined1 auVar99 [56];
  undefined1 auVar100 [24];
  undefined1 auVar101 [40];
  undefined1 auVar102 [48];
  undefined1 auVar103 [56];
  long *in_RDI;
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log op;
  Mat *m;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 y_1;
  __m256 z_1;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_1;
  __m256i imm0_1;
  v4sf y_2;
  v4sf z_2;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_2;
  v4si emm0;
  undefined8 local_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  int local_28bc;
  undefined8 local_28b8;
  undefined8 local_28b0;
  undefined8 local_28a8;
  undefined4 local_28a0;
  long local_2898;
  undefined4 local_2890;
  undefined4 local_288c;
  undefined4 local_2888;
  undefined4 local_2884;
  undefined4 local_2880;
  undefined8 local_2878;
  undefined1 (*local_2870) [64];
  int local_2868;
  int local_2864;
  int local_2860;
  int local_285c;
  int local_2858;
  int local_2854;
  int local_2850;
  undefined1 local_2849 [9];
  long *local_2840;
  undefined1 local_2835;
  int local_2834;
  undefined8 *local_2828;
  undefined8 *local_2820;
  undefined8 *local_2810;
  undefined1 (*local_2808) [64];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 (*local_2790) [64];
  undefined1 (*local_2788) [64];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined1 (*local_2760) [64];
  undefined1 (*local_2758) [64];
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined1 (*local_2740) [64];
  long local_2738;
  undefined4 local_272c;
  long local_2728;
  undefined1 (*local_2720) [64];
  undefined4 local_2714;
  int local_2710;
  int local_270c;
  undefined8 *local_2708;
  undefined4 local_26fc;
  long local_26f8;
  undefined8 *local_26e8;
  undefined8 *local_26c0;
  undefined1 *local_26b8;
  undefined8 *local_26b0;
  undefined1 *local_26a8;
  undefined8 *local_26a0;
  undefined1 *local_2698;
  undefined1 (*local_2690) [64];
  undefined1 *local_2688;
  undefined1 local_2680 [8];
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  ushort local_2582;
  undefined1 local_2580 [16];
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined2 local_2502;
  float local_2500 [2];
  float afStack_24f8 [2];
  float afStack_24f0 [2];
  float afStack_24e8 [2];
  float afStack_24e0 [2];
  float afStack_24d8 [2];
  float afStack_24d0 [2];
  float afStack_24c8 [2];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  int local_2400 [2];
  int aiStack_23f8 [2];
  int aiStack_23f0 [2];
  int aiStack_23e8 [2];
  int aiStack_23e0 [2];
  int aiStack_23d8 [2];
  int aiStack_23d0 [2];
  int aiStack_23c8 [2];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  float local_2380 [2];
  float afStack_2378 [2];
  float afStack_2370 [2];
  float afStack_2368 [2];
  float afStack_2360 [2];
  float afStack_2358 [2];
  float afStack_2350 [2];
  float afStack_2348 [2];
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  int local_2140 [2];
  int aiStack_2138 [2];
  int aiStack_2130 [2];
  int aiStack_2128 [2];
  int aiStack_2120 [2];
  int aiStack_2118 [2];
  int aiStack_2110 [2];
  int aiStack_2108 [2];
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  float local_2080 [2];
  float afStack_2078 [2];
  float afStack_2070 [2];
  float afStack_2068 [2];
  float afStack_2060 [2];
  float afStack_2058 [2];
  float afStack_2050 [2];
  float afStack_2048 [2];
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  float local_1fc0 [2];
  float afStack_1fb8 [2];
  float afStack_1fb0 [2];
  float afStack_1fa8 [2];
  float afStack_1fa0 [2];
  float afStack_1f98 [2];
  float afStack_1f90 [2];
  float afStack_1f88 [2];
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  float local_1f40 [2];
  float afStack_1f38 [2];
  float afStack_1f30 [2];
  float afStack_1f28 [2];
  float afStack_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  float local_1e80 [2];
  float afStack_1e78 [2];
  float afStack_1e70 [2];
  float afStack_1e68 [2];
  float afStack_1e60 [2];
  float afStack_1e58 [2];
  float afStack_1e50 [2];
  float afStack_1e48 [2];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  float local_1dc0 [2];
  float afStack_1db8 [2];
  float afStack_1db0 [2];
  float afStack_1da8 [2];
  float afStack_1da0 [2];
  float afStack_1d98 [2];
  float afStack_1d90 [2];
  float afStack_1d88 [2];
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float local_1d00 [2];
  float afStack_1cf8 [2];
  float afStack_1cf0 [2];
  float afStack_1ce8 [2];
  float afStack_1ce0 [2];
  float afStack_1cd8 [2];
  float afStack_1cd0 [2];
  float afStack_1cc8 [2];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40 [2];
  float afStack_1c38 [2];
  float afStack_1c30 [2];
  float afStack_1c28 [2];
  float afStack_1c20 [2];
  float afStack_1c18 [2];
  float afStack_1c10 [2];
  float afStack_1c08 [2];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  float local_1b80 [2];
  float afStack_1b78 [2];
  float afStack_1b70 [2];
  float afStack_1b68 [2];
  float afStack_1b60 [2];
  float afStack_1b58 [2];
  float afStack_1b50 [2];
  float afStack_1b48 [2];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  float local_1ac0 [2];
  float afStack_1ab8 [2];
  float afStack_1ab0 [2];
  float afStack_1aa8 [2];
  float afStack_1aa0 [2];
  float afStack_1a98 [2];
  float afStack_1a90 [2];
  float afStack_1a88 [2];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  float local_1a00 [2];
  float afStack_19f8 [2];
  float afStack_19f0 [2];
  float afStack_19e8 [2];
  float afStack_19e0 [2];
  float afStack_19d8 [2];
  float afStack_19d0 [2];
  float afStack_19c8 [2];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  float local_1980 [2];
  float afStack_1978 [2];
  float afStack_1970 [2];
  float afStack_1968 [2];
  float afStack_1960 [2];
  float afStack_1958 [2];
  float afStack_1950 [2];
  float afStack_1948 [2];
  float local_1940 [2];
  float afStack_1938 [2];
  float afStack_1930 [2];
  float afStack_1928 [2];
  float afStack_1920 [2];
  float afStack_1918 [2];
  float afStack_1910 [2];
  float afStack_1908 [2];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  ushort local_1882;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  float local_1840 [2];
  float afStack_1838 [2];
  float afStack_1830 [2];
  float afStack_1828 [2];
  float afStack_1820 [2];
  float afStack_1818 [2];
  float afStack_1810 [2];
  float afStack_1808 [2];
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  float local_1780 [2];
  float afStack_1778 [2];
  float afStack_1770 [2];
  float afStack_1768 [2];
  float afStack_1760 [2];
  float afStack_1758 [2];
  float afStack_1750 [2];
  float afStack_1748 [2];
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  float local_1680 [2];
  float afStack_1678 [2];
  float afStack_1670 [2];
  float afStack_1668 [2];
  float afStack_1660 [2];
  float afStack_1658 [2];
  float afStack_1650 [2];
  float afStack_1648 [2];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined4 local_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [64];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0 [2];
  float afStack_14b8 [2];
  float afStack_14b0 [2];
  float afStack_14a8 [2];
  float afStack_14a0 [2];
  float afStack_1498 [2];
  float afStack_1490 [2];
  float afStack_1488 [2];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  ushort local_12c2;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined2 local_11c2;
  undefined1 local_11c0 [8];
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [8];
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined4 local_1100;
  undefined4 uStack_10fc;
  undefined4 uStack_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined4 uStack_10e8;
  undefined4 uStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [8];
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  ulong uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined4 local_e80;
  undefined4 uStack_e7c;
  undefined4 uStack_e78;
  undefined4 uStack_e74;
  undefined4 uStack_e70;
  undefined4 uStack_e6c;
  undefined4 uStack_e68;
  undefined4 uStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 *local_e28;
  float *local_e20;
  undefined1 *local_e18;
  undefined1 *local_e10;
  float *local_e08;
  undefined1 *local_e00;
  float *local_df8;
  undefined1 *local_df0;
  undefined1 *local_de8;
  float *local_de0;
  undefined1 *local_dd8;
  undefined1 *local_dd0;
  float *local_dc8;
  undefined1 *local_dc0;
  undefined1 *local_db8;
  float *local_db0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  float *local_d98;
  undefined1 *local_d90;
  undefined1 *local_d88;
  float *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  float *local_d68;
  undefined1 *local_d60;
  undefined1 *local_d58;
  float *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  float *local_d30;
  float *local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0 [2];
  float afStack_b98 [2];
  float afStack_b90 [2];
  float afStack_b88 [2];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40 [2];
  float afStack_b38 [2];
  float afStack_b30 [2];
  float afStack_b28 [2];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0 [2];
  float afStack_ad8 [2];
  float afStack_ad0 [2];
  float afStack_ac8 [2];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  float local_a80 [2];
  float afStack_a78 [2];
  float afStack_a70 [2];
  float afStack_a68 [2];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20 [2];
  float afStack_a18 [2];
  float afStack_a10 [2];
  float afStack_a08 [2];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  float afStack_9b8 [2];
  float afStack_9b0 [2];
  float afStack_9a8 [2];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  ulong uStack_948;
  float local_940 [2];
  float afStack_938 [2];
  float afStack_930 [2];
  float afStack_928 [2];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0 [2];
  float afStack_8d8 [2];
  float afStack_8d0 [2];
  float afStack_8c8 [2];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  float local_880 [2];
  float afStack_878 [2];
  float afStack_870 [2];
  float afStack_868 [2];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined4 local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined4 local_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_670 [8];
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [8];
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 *local_438;
  float *local_430;
  float *local_428;
  undefined1 *local_420;
  float *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  float *local_400;
  undefined1 *local_3f8;
  float *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  float *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  float *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  float *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  float *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  float *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  float *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  float *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0 [2];
  float afStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270 [2];
  float afStack_268 [2];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240 [2];
  float afStack_238 [2];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2850 = *(int *)((long)in_RDI + 0x2c);
  local_2854 = (int)in_RDI[6];
  local_2858 = *(int *)((long)in_RDI + 0x34);
  local_285c = (int)in_RDI[7];
  local_2860 = (int)in_RDI[3];
  local_2864 = local_2850 * local_2854 * local_2858 * local_2860;
  local_2840 = in_RDI;
  for (local_2868 = 0; local_2868 < local_285c; local_2868 = local_2868 + 1) {
    local_2828 = &local_28b8;
    local_270c = *(int *)((long)local_2840 + 0x2c);
    local_2710 = (int)local_2840[6];
    local_2714 = *(undefined4 *)((long)local_2840 + 0x34);
    local_2720 = (undefined1 (*) [64])
                 (*local_2840 + local_2840[8] * (long)local_2868 * local_2840[2]);
    local_2728 = local_2840[2];
    local_272c = (undefined4)local_2840[3];
    local_2738 = local_2840[4];
    local_2708 = &local_28b8;
    local_26f8 = (long)local_270c * (long)local_2710 * local_2728;
    local_2820 = &local_28b8;
    local_2810 = &local_28b8;
    local_26fc = 0x10;
    local_2834 = local_2868;
    local_2835 = 1;
    local_28b8 = 0;
    local_28a8 = 0;
    local_28a0 = 0;
    local_2890 = 0;
    local_288c = 0;
    local_2888 = 0;
    local_2884 = 0;
    local_2880 = 0;
    local_2878 = 0;
    local_28b0 = 0;
    local_2870 = local_2720;
    for (local_28bc = 0; local_28bc + 0xf < local_2864; local_28bc = local_28bc + 0x10) {
      local_2808 = local_2870;
      auVar96 = *(undefined1 (*) [48])*local_2870;
      uStack_20d0 = *(undefined8 *)(*local_2870 + 0x30);
      uStack_20c8 = *(undefined8 *)(*local_2870 + 0x38);
      local_26b8 = local_2849;
      local_26c0 = &local_2900;
      local_2500[0] = 1.0;
      local_2500[1] = 1.0;
      afStack_24f8[0] = 1.0;
      afStack_24f8[1] = 1.0;
      afStack_24f0[0] = 1.0;
      afStack_24f0[1] = 1.0;
      afStack_24e8[0] = 1.0;
      afStack_24e8[1] = 1.0;
      afStack_24e0[0] = 1.0;
      afStack_24e0[1] = 1.0;
      afStack_24d8[0] = 1.0;
      afStack_24d8[1] = 1.0;
      afStack_24d0[0] = 1.0;
      afStack_24d0[1] = 1.0;
      afStack_24c8[0] = 1.0;
      afStack_24c8[1] = 1.0;
      local_2300 = 0;
      uStack_22f8 = 0;
      uStack_22f0 = 0;
      uStack_22e8 = 0;
      uStack_22e0 = 0;
      uStack_22d8 = 0;
      uStack_22d0 = 0;
      uStack_22c8 = 0;
      uVar21 = vcmpps_avx512f(*local_2870,ZEXT1664(ZEXT816(0)),2);
      local_2502 = (undefined2)uVar21;
      local_2480._0_8_ = auVar96._0_8_;
      local_2100 = local_2480._0_8_;
      local_2480._8_8_ = auVar96._8_8_;
      uStack_20f8 = local_2480._8_8_;
      local_2480._16_8_ = auVar96._16_8_;
      uStack_20f0 = local_2480._16_8_;
      local_2480._24_8_ = auVar96._24_8_;
      uStack_20e8 = local_2480._24_8_;
      local_2480._32_8_ = auVar96._32_8_;
      uStack_20e0 = local_2480._32_8_;
      local_2480._40_8_ = auVar96._40_8_;
      uStack_20d8 = local_2480._40_8_;
      local_2140[0] = 0x800000;
      local_2140[1] = 0x800000;
      aiStack_2138[0] = 0x800000;
      aiStack_2138[1] = 0x800000;
      aiStack_2130[0] = 0x800000;
      aiStack_2130[1] = 0x800000;
      aiStack_2128[0] = 0x800000;
      aiStack_2128[1] = 0x800000;
      aiStack_2120[0] = 0x800000;
      aiStack_2120[1] = 0x800000;
      aiStack_2118[0] = 0x800000;
      aiStack_2118[1] = 0x800000;
      aiStack_2110[0] = 0x800000;
      aiStack_2110[1] = 0x800000;
      aiStack_2108[0] = 0x800000;
      aiStack_2108[1] = 0x800000;
      auVar36._8_4_ = 0x800000;
      auVar36._12_4_ = 0x800000;
      auVar36._0_4_ = 0x800000;
      auVar36._4_4_ = 0x800000;
      auVar36._16_4_ = 0x800000;
      auVar36._20_4_ = 0x800000;
      auVar36._24_4_ = 0x800000;
      auVar36._28_4_ = 0x800000;
      auVar36._32_4_ = 0x800000;
      auVar36._36_4_ = 0x800000;
      auVar36._40_4_ = 0x800000;
      auVar36._44_4_ = 0x800000;
      auVar36._48_4_ = 0x800000;
      auVar36._52_4_ = 0x800000;
      auVar36._56_4_ = 0x800000;
      auVar36._60_4_ = 0x800000;
      auVar104 = vmaxps_avx512f(*local_2870,auVar36);
      local_2480._0_8_ = auVar104._0_8_;
      local_1580 = local_2480._0_8_;
      local_2480._8_8_ = auVar104._8_8_;
      uStack_1578 = local_2480._8_8_;
      local_2480._16_8_ = auVar104._16_8_;
      uStack_1570 = local_2480._16_8_;
      local_2480._24_8_ = auVar104._24_8_;
      uStack_1568 = local_2480._24_8_;
      local_2480._32_8_ = auVar104._32_8_;
      uStack_1560 = local_2480._32_8_;
      local_2480._40_8_ = auVar104._40_8_;
      uStack_1558 = local_2480._40_8_;
      local_2480._48_8_ = auVar104._48_8_;
      uStack_1550 = local_2480._48_8_;
      local_2480._56_8_ = auVar104._56_8_;
      uStack_1548 = local_2480._56_8_;
      local_15c0 = local_2480._0_8_;
      uStack_15b8 = local_2480._8_8_;
      uStack_15b0 = local_2480._16_8_;
      uStack_15a8 = local_2480._24_8_;
      uStack_15a0 = local_2480._32_8_;
      uStack_1598 = local_2480._40_8_;
      uStack_1590 = local_2480._48_8_;
      uStack_1588 = local_2480._56_8_;
      local_15c4 = 0x17;
      auVar105 = vmovdqa64_avx512f(auVar104);
      auVar105 = vpsrld_avx512f(auVar105,ZEXT416(0x17));
      auVar105 = vmovdqa64_avx512f(auVar105);
      local_23c0 = local_2480._0_8_;
      uStack_23b8 = local_2480._8_8_;
      uStack_23b0 = local_2480._16_8_;
      uStack_23a8 = local_2480._24_8_;
      uStack_23a0 = local_2480._32_8_;
      uStack_2398 = local_2480._40_8_;
      uStack_2390 = local_2480._48_8_;
      uStack_2388 = local_2480._56_8_;
      local_2400[0] = -0x7f800001;
      local_2400[1] = -0x7f800001;
      aiStack_23f8[0] = -0x7f800001;
      aiStack_23f8[1] = -0x7f800001;
      aiStack_23f0[0] = -0x7f800001;
      aiStack_23f0[1] = -0x7f800001;
      aiStack_23e8[0] = -0x7f800001;
      aiStack_23e8[1] = -0x7f800001;
      aiStack_23e0[0] = -0x7f800001;
      aiStack_23e0[1] = -0x7f800001;
      aiStack_23d8[0] = -0x7f800001;
      aiStack_23d8[1] = -0x7f800001;
      aiStack_23d0[0] = -0x7f800001;
      aiStack_23d0[1] = -0x7f800001;
      aiStack_23c8[0] = -0x7f800001;
      aiStack_23c8[1] = -0x7f800001;
      auVar106 = vmovdqa64_avx512f(auVar104);
      auVar104._8_4_ = -0x7f800001;
      auVar104._12_4_ = -0x7f800001;
      auVar104._0_4_ = -0x7f800001;
      auVar104._4_4_ = -0x7f800001;
      auVar104._16_4_ = -0x7f800001;
      auVar104._20_4_ = -0x7f800001;
      auVar104._24_4_ = -0x7f800001;
      auVar104._28_4_ = -0x7f800001;
      auVar104._32_4_ = -0x7f800001;
      auVar104._36_4_ = -0x7f800001;
      auVar104._40_4_ = -0x7f800001;
      auVar104._44_4_ = -0x7f800001;
      auVar104._48_4_ = -0x7f800001;
      auVar104._52_4_ = -0x7f800001;
      auVar104._56_4_ = -0x7f800001;
      auVar104._60_4_ = -0x7f800001;
      auVar104 = vmovdqa64_avx512f(auVar104);
      auVar104 = vpandd_avx512f(auVar106,auVar104);
      auVar104 = vmovdqa64_avx512f(auVar104);
      local_2480._0_8_ = auVar104._0_8_;
      local_1480 = local_2480._0_8_;
      local_2480._8_8_ = auVar104._8_8_;
      uStack_1478 = local_2480._8_8_;
      local_2480._16_8_ = auVar104._16_8_;
      uStack_1470 = local_2480._16_8_;
      local_2480._24_8_ = auVar104._24_8_;
      uStack_1468 = local_2480._24_8_;
      local_2480._32_8_ = auVar104._32_8_;
      uStack_1460 = local_2480._32_8_;
      local_2480._40_8_ = auVar104._40_8_;
      uStack_1458 = local_2480._40_8_;
      local_2480._48_8_ = auVar104._48_8_;
      uStack_1450 = local_2480._48_8_;
      local_2480._56_8_ = auVar104._56_8_;
      uStack_1448 = local_2480._56_8_;
      local_14c0[0] = 0.5;
      local_14c0[1] = 0.5;
      afStack_14b8[0] = 0.5;
      afStack_14b8[1] = 0.5;
      afStack_14b0[0] = 0.5;
      afStack_14b0[1] = 0.5;
      afStack_14a8[0] = 0.5;
      afStack_14a8[1] = 0.5;
      afStack_14a0[0] = 0.5;
      afStack_14a0[1] = 0.5;
      afStack_1498[0] = 0.5;
      afStack_1498[1] = 0.5;
      afStack_1490[0] = 0.5;
      afStack_1490[1] = 0.5;
      afStack_1488[0] = 0.5;
      afStack_1488[1] = 0.5;
      auVar104 = vmovdqa64_avx512f(auVar104);
      auVar62._8_4_ = 0.5;
      auVar62._12_4_ = 0.5;
      auVar62._0_4_ = 0.5;
      auVar62._4_4_ = 0.5;
      auVar62._16_4_ = 0.5;
      auVar62._20_4_ = 0.5;
      auVar62._24_4_ = 0.5;
      auVar62._28_4_ = 0.5;
      auVar62._32_4_ = 0.5;
      auVar62._36_4_ = 0.5;
      auVar62._40_4_ = 0.5;
      auVar62._44_4_ = 0.5;
      auVar62._48_4_ = 0.5;
      auVar62._52_4_ = 0.5;
      auVar62._56_4_ = 0.5;
      auVar62._60_4_ = 0.5;
      auVar106 = vmovdqa64_avx512f(auVar62);
      auVar104 = vpord_avx512f(auVar104,auVar106);
      auVar104 = vmovdqa64_avx512f(auVar104);
      auVar105 = vmovdqa64_avx512f(auVar105);
      auVar106 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_1400 = vmovdqa64_avx512f(auVar105);
      local_1440 = vmovdqa64_avx512f(auVar106);
      auVar105 = vmovdqa64_avx512f(local_1400);
      auVar106 = vmovdqa64_avx512f(local_1440);
      auVar105 = vpsubd_avx512f(auVar105,auVar106);
      local_24c0 = vmovdqa64_avx512f(auVar105);
      auVar105 = vmovdqa64_avx512f(local_24c0);
      local_13c0 = vmovdqa64_avx512f(auVar105);
      auVar105 = vcvtdq2ps_avx512f(local_13c0);
      local_2580._0_8_ = auVar105._0_8_;
      local_1640 = local_2580._0_8_;
      local_2580._8_8_ = auVar105._8_8_;
      uStack_1638 = local_2580._8_8_;
      uStack_2570 = auVar105._16_8_;
      uStack_1630 = uStack_2570;
      uStack_2568 = auVar105._24_8_;
      uStack_1628 = uStack_2568;
      uStack_2560 = auVar105._32_8_;
      uStack_1620 = uStack_2560;
      uStack_2558 = auVar105._40_8_;
      uStack_1618 = uStack_2558;
      uStack_2550 = auVar105._48_8_;
      uStack_1610 = uStack_2550;
      uStack_2548 = auVar105._56_8_;
      uStack_1608 = uStack_2548;
      local_1680[0] = 1.0;
      local_1680[1] = 1.0;
      afStack_1678[0] = 1.0;
      afStack_1678[1] = 1.0;
      afStack_1670[0] = 1.0;
      afStack_1670[1] = 1.0;
      afStack_1668[0] = 1.0;
      afStack_1668[1] = 1.0;
      afStack_1660[0] = 1.0;
      afStack_1660[1] = 1.0;
      afStack_1658[0] = 1.0;
      afStack_1658[1] = 1.0;
      afStack_1650[0] = 1.0;
      afStack_1650[1] = 1.0;
      afStack_1648[0] = 1.0;
      afStack_1648[1] = 1.0;
      auVar61._8_4_ = 1.0;
      auVar61._12_4_ = 1.0;
      auVar61._0_4_ = 1.0;
      auVar61._4_4_ = 1.0;
      auVar61._16_4_ = 1.0;
      auVar61._20_4_ = 1.0;
      auVar61._24_4_ = 1.0;
      auVar61._28_4_ = 1.0;
      auVar61._32_4_ = 1.0;
      auVar61._36_4_ = 1.0;
      auVar61._40_4_ = 1.0;
      auVar61._44_4_ = 1.0;
      auVar61._48_4_ = 1.0;
      auVar61._52_4_ = 1.0;
      auVar61._56_4_ = 1.0;
      auVar61._60_4_ = 1.0;
      auVar106 = vaddps_avx512f(auVar105,auVar61);
      uVar21 = vcmpps_avx512f(auVar104,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      local_2582 = (ushort)uVar21;
      local_2480._0_8_ = auVar104._0_8_;
      local_2340 = local_2480._0_8_;
      local_2480._8_8_ = auVar104._8_8_;
      uStack_2338 = local_2480._8_8_;
      local_2480._16_8_ = auVar104._16_8_;
      uStack_2330 = local_2480._16_8_;
      local_2480._24_8_ = auVar104._24_8_;
      uStack_2328 = local_2480._24_8_;
      local_2480._32_8_ = auVar104._32_8_;
      uStack_2320 = local_2480._32_8_;
      local_2480._40_8_ = auVar104._40_8_;
      uStack_2318 = local_2480._40_8_;
      local_2480._48_8_ = auVar104._48_8_;
      uStack_2310 = local_2480._48_8_;
      local_2480._56_8_ = auVar104._56_8_;
      uStack_2308 = local_2480._56_8_;
      local_2380[0] = 1.0;
      local_2380[1] = 1.0;
      afStack_2378[0] = 1.0;
      afStack_2378[1] = 1.0;
      afStack_2370[0] = 1.0;
      afStack_2370[1] = 1.0;
      afStack_2368[0] = 1.0;
      afStack_2368[1] = 1.0;
      afStack_2360[0] = 1.0;
      afStack_2360[1] = 1.0;
      afStack_2358[0] = 1.0;
      afStack_2358[1] = 1.0;
      afStack_2350[0] = 1.0;
      afStack_2350[1] = 1.0;
      afStack_2348[0] = 1.0;
      afStack_2348[1] = 1.0;
      auVar105._8_4_ = 1.0;
      auVar105._12_4_ = 1.0;
      auVar105._0_4_ = 1.0;
      auVar105._4_4_ = 1.0;
      auVar105._16_4_ = 1.0;
      auVar105._20_4_ = 1.0;
      auVar105._24_4_ = 1.0;
      auVar105._28_4_ = 1.0;
      auVar105._32_4_ = 1.0;
      auVar105._36_4_ = 1.0;
      auVar105._40_4_ = 1.0;
      auVar105._44_4_ = 1.0;
      auVar105._48_4_ = 1.0;
      auVar105._52_4_ = 1.0;
      auVar105._56_4_ = 1.0;
      auVar105._60_4_ = 1.0;
      local_2600 = vsubps_avx512f(auVar104,auVar105);
      local_2580._0_8_ = auVar106._0_8_;
      local_1900 = local_2580._0_8_;
      local_2580._8_8_ = auVar106._8_8_;
      uStack_18f8 = local_2580._8_8_;
      uStack_2570 = auVar106._16_8_;
      uStack_18f0 = uStack_2570;
      uStack_2568 = auVar106._24_8_;
      uStack_18e8 = uStack_2568;
      uStack_2560 = auVar106._32_8_;
      uStack_18e0 = uStack_2560;
      uStack_2558 = auVar106._40_8_;
      uStack_18d8 = uStack_2558;
      uStack_2550 = auVar106._48_8_;
      uStack_18d0 = uStack_2550;
      uStack_2548 = auVar106._56_8_;
      uStack_18c8 = uStack_2548;
      local_1940[0] = 1.0;
      local_1940[1] = 1.0;
      afStack_1938[0] = 1.0;
      afStack_1938[1] = 1.0;
      afStack_1930[0] = 1.0;
      afStack_1930[1] = 1.0;
      afStack_1928[0] = 1.0;
      afStack_1928[1] = 1.0;
      afStack_1920[0] = 1.0;
      afStack_1920[1] = 1.0;
      afStack_1918[0] = 1.0;
      afStack_1918[1] = 1.0;
      afStack_1910[0] = 1.0;
      afStack_1910[1] = 1.0;
      afStack_1908[0] = 1.0;
      afStack_1908[1] = 1.0;
      local_1800 = local_2580._0_8_;
      uStack_17f8 = local_2580._8_8_;
      uStack_17f0 = uStack_2570;
      uStack_17e8 = uStack_2568;
      uStack_17e0 = uStack_2560;
      uStack_17d8 = uStack_2558;
      uStack_17d0 = uStack_2550;
      uStack_17c8 = uStack_2548;
      local_1840[0] = 1.0;
      local_1840[1] = 1.0;
      afStack_1838[0] = 1.0;
      afStack_1838[1] = 1.0;
      afStack_1830[0] = 1.0;
      afStack_1830[1] = 1.0;
      afStack_1828[0] = 1.0;
      afStack_1828[1] = 1.0;
      afStack_1820[0] = 1.0;
      afStack_1820[1] = 1.0;
      afStack_1818[0] = 1.0;
      afStack_1818[1] = 1.0;
      afStack_1810[0] = 1.0;
      afStack_1810[1] = 1.0;
      afStack_1808[0] = 1.0;
      afStack_1808[1] = 1.0;
      auVar58._8_4_ = 1.0;
      auVar58._12_4_ = 1.0;
      auVar58._0_4_ = 1.0;
      auVar58._4_4_ = 1.0;
      auVar58._16_4_ = 1.0;
      auVar58._20_4_ = 1.0;
      auVar58._24_4_ = 1.0;
      auVar58._28_4_ = 1.0;
      auVar58._32_4_ = 1.0;
      auVar58._36_4_ = 1.0;
      auVar58._40_4_ = 1.0;
      auVar58._44_4_ = 1.0;
      auVar58._48_4_ = 1.0;
      auVar58._52_4_ = 1.0;
      auVar58._56_4_ = 1.0;
      auVar58._60_4_ = 1.0;
      local_1880._0_4_ = auVar106._0_4_;
      local_1880._4_4_ = auVar106._4_4_;
      uStack_1878._0_4_ = auVar106._8_4_;
      uStack_1878._4_4_ = auVar106._12_4_;
      uStack_1870._0_4_ = auVar106._16_4_;
      uStack_1870._4_4_ = auVar106._20_4_;
      uStack_1868._0_4_ = auVar106._24_4_;
      uStack_1868._4_4_ = auVar106._28_4_;
      uStack_1860._0_4_ = auVar106._32_4_;
      uStack_1860._4_4_ = auVar106._36_4_;
      uStack_1858._0_4_ = auVar106._40_4_;
      uStack_1858._4_4_ = auVar106._44_4_;
      uStack_1850._0_4_ = auVar106._48_4_;
      uStack_1850._4_4_ = auVar106._52_4_;
      uStack_1848._0_4_ = auVar106._56_4_;
      uStack_1848._4_4_ = auVar106._60_4_;
      auVar105 = vsubps_avx512f(auVar106,auVar58);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar2 = (bool)((byte)(local_2582 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2582 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2582 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2582 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2582 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2582 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2582 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar21 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_2580._4_4_ = (uint)bVar2 * auVar105._4_4_ | (uint)!bVar2 * local_1880._4_4_;
      local_2580._0_4_ = (uint)bVar1 * auVar105._0_4_ | (uint)!bVar1 * (int)local_1880;
      local_2580._8_4_ = (uint)bVar3 * auVar105._8_4_ | (uint)!bVar3 * (int)uStack_1878;
      local_2580._12_4_ = (uint)bVar4 * auVar105._12_4_ | (uint)!bVar4 * uStack_1878._4_4_;
      uStack_2570._0_4_ = (uint)bVar5 * auVar105._16_4_ | (uint)!bVar5 * (int)uStack_1870;
      uStack_2570._4_4_ = (uint)bVar6 * auVar105._20_4_ | (uint)!bVar6 * uStack_1870._4_4_;
      auVar97 = _local_2580;
      uStack_2568._0_4_ = (uint)bVar7 * auVar105._24_4_ | (uint)!bVar7 * (int)uStack_1868;
      uStack_2568._4_4_ = (uint)bVar8 * auVar105._28_4_ | (uint)!bVar8 * uStack_1868._4_4_;
      auVar16 = _local_2580;
      uStack_2560._0_4_ =
           (uint)(bVar9 & 1) * auVar105._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1860;
      uStack_2560._4_4_ = (uint)bVar10 * auVar105._36_4_ | (uint)!bVar10 * uStack_1860._4_4_;
      auVar98 = _local_2580;
      uStack_2558._0_4_ = (uint)bVar11 * auVar105._40_4_ | (uint)!bVar11 * (int)uStack_1858;
      uStack_2558._4_4_ = (uint)bVar12 * auVar105._44_4_ | (uint)!bVar12 * uStack_1858._4_4_;
      auVar96 = _local_2580;
      uStack_2550._0_4_ = (uint)bVar13 * auVar105._48_4_ | (uint)!bVar13 * (int)uStack_1850;
      uStack_2550._4_4_ = (uint)bVar14 * auVar105._52_4_ | (uint)!bVar14 * uStack_1850._4_4_;
      auVar99 = _local_2580;
      uStack_2548._0_4_ = (uint)bVar15 * auVar105._56_4_ | (uint)!bVar15 * (int)uStack_1848;
      uStack_2548._4_4_ =
           (uint)(bVar9 >> 7) * auVar105._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1848._4_4_;
      auVar105 = _local_2580;
      local_1340 = local_2600._0_8_;
      uStack_1338 = local_2600._8_8_;
      uStack_1330 = local_2600._16_8_;
      uStack_1328 = local_2600._24_8_;
      uStack_1320 = local_2600._32_8_;
      uStack_1318 = local_2600._40_8_;
      uStack_1310 = local_2600._48_8_;
      uStack_1308 = local_2600._56_8_;
      local_1380 = local_2480._0_8_;
      uStack_1378 = local_2480._8_8_;
      uStack_1370 = local_2480._16_8_;
      uStack_1368 = local_2480._24_8_;
      uStack_1360 = local_2480._32_8_;
      uStack_1358 = local_2480._40_8_;
      uStack_1350 = local_2480._48_8_;
      uStack_1348 = local_2480._56_8_;
      local_1240 = local_2600._0_8_;
      uStack_1238 = local_2600._8_8_;
      uStack_1230 = local_2600._16_8_;
      uStack_1228 = local_2600._24_8_;
      uStack_1220 = local_2600._32_8_;
      uStack_1218 = local_2600._40_8_;
      uStack_1210 = local_2600._48_8_;
      uStack_1208 = local_2600._56_8_;
      local_1280 = local_2480._0_8_;
      uStack_1278 = local_2480._8_8_;
      uStack_1270 = local_2480._16_8_;
      uStack_1268 = local_2480._24_8_;
      uStack_1260 = local_2480._32_8_;
      uStack_1258 = local_2480._40_8_;
      uStack_1250 = local_2480._48_8_;
      uStack_1248 = local_2480._56_8_;
      local_12c0._0_4_ = local_2600._0_4_;
      local_12c0._4_4_ = local_2600._4_4_;
      uStack_12b8._0_4_ = local_2600._8_4_;
      uStack_12b8._4_4_ = local_2600._12_4_;
      uStack_12b0._0_4_ = local_2600._16_4_;
      uStack_12b0._4_4_ = local_2600._20_4_;
      uStack_12a8._0_4_ = local_2600._24_4_;
      uStack_12a8._4_4_ = local_2600._28_4_;
      uStack_12a0._0_4_ = local_2600._32_4_;
      uStack_12a0._4_4_ = local_2600._36_4_;
      uStack_1298._0_4_ = local_2600._40_4_;
      uStack_1298._4_4_ = local_2600._44_4_;
      uStack_1290._0_4_ = local_2600._48_4_;
      uStack_1290._4_4_ = local_2600._52_4_;
      uStack_1288._0_4_ = local_2600._56_4_;
      uStack_1288._4_4_ = local_2600._60_4_;
      auVar104 = vaddps_avx512f(local_2600,auVar104);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar2 = (bool)((byte)(local_2582 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2582 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2582 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2582 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2582 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2582 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2582 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_2480._4_4_ = (uint)bVar2 * auVar104._4_4_ | (uint)!bVar2 * local_12c0._4_4_;
      local_2480._0_4_ = (uint)bVar1 * auVar104._0_4_ | (uint)!bVar1 * (int)local_12c0;
      local_2480._8_4_ = (uint)bVar3 * auVar104._8_4_ | (uint)!bVar3 * (int)uStack_12b8;
      local_2480._12_4_ = (uint)bVar4 * auVar104._12_4_ | (uint)!bVar4 * uStack_12b8._4_4_;
      local_2480._16_4_ = (uint)bVar5 * auVar104._16_4_ | (uint)!bVar5 * (int)uStack_12b0;
      local_2480._20_4_ = (uint)bVar6 * auVar104._20_4_ | (uint)!bVar6 * uStack_12b0._4_4_;
      auVar100 = local_2480._0_24_;
      local_2480._24_4_ = (uint)bVar7 * auVar104._24_4_ | (uint)!bVar7 * (int)uStack_12a8;
      local_2480._28_4_ = (uint)bVar8 * auVar104._28_4_ | (uint)!bVar8 * uStack_12a8._4_4_;
      auVar19 = local_2480._0_32_;
      local_2480._32_4_ =
           (uint)(bVar9 & 1) * auVar104._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_12a0;
      local_2480._36_4_ = (uint)bVar10 * auVar104._36_4_ | (uint)!bVar10 * uStack_12a0._4_4_;
      auVar101 = local_2480._0_40_;
      local_2480._40_4_ = (uint)bVar11 * auVar104._40_4_ | (uint)!bVar11 * (int)uStack_1298;
      local_2480._44_4_ = (uint)bVar12 * auVar104._44_4_ | (uint)!bVar12 * uStack_1298._4_4_;
      auVar102 = local_2480._0_48_;
      local_2480._48_4_ = (uint)bVar13 * auVar104._48_4_ | (uint)!bVar13 * (int)uStack_1290;
      local_2480._52_4_ = (uint)bVar14 * auVar104._52_4_ | (uint)!bVar14 * uStack_1290._4_4_;
      auVar103 = local_2480._0_56_;
      local_2480._56_4_ = (uint)bVar15 * auVar104._56_4_ | (uint)!bVar15 * (int)uStack_1288;
      local_2480._60_4_ =
           (uint)(bVar9 >> 7) * auVar104._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1288._4_4_;
      auVar104 = local_2480;
      local_21c0 = local_2480._0_8_;
      uStack_21b8 = local_2480._8_8_;
      local_2480._16_8_ = auVar100._16_8_;
      uStack_21b0 = local_2480._16_8_;
      local_2480._24_8_ = auVar19._24_8_;
      uStack_21a8 = local_2480._24_8_;
      local_2480._32_8_ = auVar101._32_8_;
      uStack_21a0 = local_2480._32_8_;
      local_2480._40_8_ = auVar102._40_8_;
      uStack_2198 = local_2480._40_8_;
      local_2480._48_8_ = auVar103._48_8_;
      uStack_2190 = local_2480._48_8_;
      local_2480._56_8_ = auVar104._56_8_;
      uStack_2188 = local_2480._56_8_;
      auVar35._16_8_ = local_2480._16_8_;
      auVar35._0_16_ = local_2480._0_16_;
      auVar35._24_8_ = local_2480._24_8_;
      auVar35._32_8_ = local_2480._32_8_;
      auVar35._40_8_ = local_2480._40_8_;
      auVar35._48_8_ = local_2480._48_8_;
      auVar35._56_8_ = local_2480._56_8_;
      auVar34._16_8_ = local_2480._16_8_;
      auVar34._0_16_ = local_2480._0_16_;
      auVar34._24_8_ = local_2480._24_8_;
      auVar34._32_8_ = local_2480._32_8_;
      auVar34._40_8_ = local_2480._40_8_;
      auVar34._48_8_ = local_2480._48_8_;
      auVar34._56_8_ = local_2480._56_8_;
      local_2640 = vmulps_avx512f(auVar35,auVar34);
      uStack_2678._0_4_ = 0.070376836;
      uStack_2678._4_4_ = 0.070376836;
      local_2680._0_4_ = 0.070376836;
      local_2680._4_4_ = 0.070376836;
      local_1980[0] = 0.070376836;
      local_1980[1] = 0.070376836;
      afStack_1978[0] = 0.070376836;
      afStack_1978[1] = 0.070376836;
      afStack_1970[0] = 0.070376836;
      afStack_1970[1] = 0.070376836;
      afStack_1968[0] = 0.070376836;
      afStack_1968[1] = 0.070376836;
      afStack_1960[0] = 0.070376836;
      afStack_1960[1] = 0.070376836;
      afStack_1958[0] = 0.070376836;
      afStack_1958[1] = 0.070376836;
      afStack_1950[0] = 0.070376836;
      afStack_1950[1] = 0.070376836;
      afStack_1948[0] = 0.070376836;
      afStack_1948[1] = 0.070376836;
      local_19c0 = local_2480._0_8_;
      uStack_19b8 = local_2480._8_8_;
      uStack_19b0 = local_2480._16_8_;
      uStack_19a8 = local_2480._24_8_;
      uStack_19a0 = local_2480._32_8_;
      uStack_1998 = local_2480._40_8_;
      uStack_1990 = local_2480._48_8_;
      uStack_1988 = local_2480._56_8_;
      local_1a00[0] = -0.1151461;
      local_1a00[1] = -0.1151461;
      afStack_19f8[0] = -0.1151461;
      afStack_19f8[1] = -0.1151461;
      afStack_19f0[0] = -0.1151461;
      afStack_19f0[1] = -0.1151461;
      afStack_19e8[0] = -0.1151461;
      afStack_19e8[1] = -0.1151461;
      afStack_19e0[0] = -0.1151461;
      afStack_19e0[1] = -0.1151461;
      afStack_19d8[0] = -0.1151461;
      afStack_19d8[1] = -0.1151461;
      afStack_19d0[0] = -0.1151461;
      afStack_19d0[1] = -0.1151461;
      afStack_19c8[0] = -0.1151461;
      afStack_19c8[1] = -0.1151461;
      auVar57._16_4_ = 0.070376836;
      auVar57._20_4_ = 0.070376836;
      auVar57._0_16_ = _local_2680;
      auVar57._24_4_ = 0.070376836;
      auVar57._28_4_ = 0.070376836;
      auVar57._32_4_ = 0.070376836;
      auVar57._36_4_ = 0.070376836;
      auVar57._40_4_ = 0.070376836;
      auVar57._44_4_ = 0.070376836;
      auVar57._48_4_ = 0.070376836;
      auVar57._52_4_ = 0.070376836;
      auVar57._56_4_ = 0.070376836;
      auVar57._60_4_ = 0.070376836;
      auVar56._16_8_ = local_2480._16_8_;
      auVar56._0_16_ = local_2480._0_16_;
      auVar56._24_8_ = local_2480._24_8_;
      auVar56._32_8_ = local_2480._32_8_;
      auVar56._40_8_ = local_2480._40_8_;
      auVar56._48_8_ = local_2480._48_8_;
      auVar56._56_8_ = local_2480._56_8_;
      auVar55._8_4_ = -0.1151461;
      auVar55._12_4_ = -0.1151461;
      auVar55._0_4_ = -0.1151461;
      auVar55._4_4_ = -0.1151461;
      auVar55._16_4_ = -0.1151461;
      auVar55._20_4_ = -0.1151461;
      auVar55._24_4_ = -0.1151461;
      auVar55._28_4_ = -0.1151461;
      auVar55._32_4_ = -0.1151461;
      auVar55._36_4_ = -0.1151461;
      auVar55._40_4_ = -0.1151461;
      auVar55._44_4_ = -0.1151461;
      auVar55._48_4_ = -0.1151461;
      auVar55._52_4_ = -0.1151461;
      auVar55._56_4_ = -0.1151461;
      auVar55._60_4_ = -0.1151461;
      auVar104 = vfmadd213ps_avx512f(auVar56,auVar57,auVar55);
      local_2680 = auVar104._0_8_;
      local_1a40 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1a38 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1a30 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1a28 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1a20 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1a18 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1a10 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1a08 = uStack_2648;
      local_1a80 = local_2480._0_8_;
      uStack_1a78 = local_2480._8_8_;
      uStack_1a70 = local_2480._16_8_;
      uStack_1a68 = local_2480._24_8_;
      uStack_1a60 = local_2480._32_8_;
      uStack_1a58 = local_2480._40_8_;
      uStack_1a50 = local_2480._48_8_;
      uStack_1a48 = local_2480._56_8_;
      local_1ac0[0] = 0.116769984;
      local_1ac0[1] = 0.116769984;
      afStack_1ab8[0] = 0.116769984;
      afStack_1ab8[1] = 0.116769984;
      afStack_1ab0[0] = 0.116769984;
      afStack_1ab0[1] = 0.116769984;
      afStack_1aa8[0] = 0.116769984;
      afStack_1aa8[1] = 0.116769984;
      afStack_1aa0[0] = 0.116769984;
      afStack_1aa0[1] = 0.116769984;
      afStack_1a98[0] = 0.116769984;
      afStack_1a98[1] = 0.116769984;
      afStack_1a90[0] = 0.116769984;
      afStack_1a90[1] = 0.116769984;
      afStack_1a88[0] = 0.116769984;
      afStack_1a88[1] = 0.116769984;
      auVar54._16_8_ = local_2480._16_8_;
      auVar54._0_16_ = local_2480._0_16_;
      auVar54._24_8_ = local_2480._24_8_;
      auVar54._32_8_ = local_2480._32_8_;
      auVar54._40_8_ = local_2480._40_8_;
      auVar54._48_8_ = local_2480._48_8_;
      auVar54._56_8_ = local_2480._56_8_;
      auVar53._8_4_ = 0.116769984;
      auVar53._12_4_ = 0.116769984;
      auVar53._0_4_ = 0.116769984;
      auVar53._4_4_ = 0.116769984;
      auVar53._16_4_ = 0.116769984;
      auVar53._20_4_ = 0.116769984;
      auVar53._24_4_ = 0.116769984;
      auVar53._28_4_ = 0.116769984;
      auVar53._32_4_ = 0.116769984;
      auVar53._36_4_ = 0.116769984;
      auVar53._40_4_ = 0.116769984;
      auVar53._44_4_ = 0.116769984;
      auVar53._48_4_ = 0.116769984;
      auVar53._52_4_ = 0.116769984;
      auVar53._56_4_ = 0.116769984;
      auVar53._60_4_ = 0.116769984;
      auVar104 = vfmadd213ps_avx512f(auVar54,auVar104,auVar53);
      local_2680 = auVar104._0_8_;
      local_1b00 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1af8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1af0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1ae8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1ae0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1ad8 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1ad0 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1ac8 = uStack_2648;
      local_1b40 = local_2480._0_8_;
      uStack_1b38 = local_2480._8_8_;
      uStack_1b30 = local_2480._16_8_;
      uStack_1b28 = local_2480._24_8_;
      uStack_1b20 = local_2480._32_8_;
      uStack_1b18 = local_2480._40_8_;
      uStack_1b10 = local_2480._48_8_;
      uStack_1b08 = local_2480._56_8_;
      local_1b80[0] = -0.12420141;
      local_1b80[1] = -0.12420141;
      afStack_1b78[0] = -0.12420141;
      afStack_1b78[1] = -0.12420141;
      afStack_1b70[0] = -0.12420141;
      afStack_1b70[1] = -0.12420141;
      afStack_1b68[0] = -0.12420141;
      afStack_1b68[1] = -0.12420141;
      afStack_1b60[0] = -0.12420141;
      afStack_1b60[1] = -0.12420141;
      afStack_1b58[0] = -0.12420141;
      afStack_1b58[1] = -0.12420141;
      afStack_1b50[0] = -0.12420141;
      afStack_1b50[1] = -0.12420141;
      afStack_1b48[0] = -0.12420141;
      afStack_1b48[1] = -0.12420141;
      auVar52._16_8_ = local_2480._16_8_;
      auVar52._0_16_ = local_2480._0_16_;
      auVar52._24_8_ = local_2480._24_8_;
      auVar52._32_8_ = local_2480._32_8_;
      auVar52._40_8_ = local_2480._40_8_;
      auVar52._48_8_ = local_2480._48_8_;
      auVar52._56_8_ = local_2480._56_8_;
      auVar51._8_4_ = -0.12420141;
      auVar51._12_4_ = -0.12420141;
      auVar51._0_4_ = -0.12420141;
      auVar51._4_4_ = -0.12420141;
      auVar51._16_4_ = -0.12420141;
      auVar51._20_4_ = -0.12420141;
      auVar51._24_4_ = -0.12420141;
      auVar51._28_4_ = -0.12420141;
      auVar51._32_4_ = -0.12420141;
      auVar51._36_4_ = -0.12420141;
      auVar51._40_4_ = -0.12420141;
      auVar51._44_4_ = -0.12420141;
      auVar51._48_4_ = -0.12420141;
      auVar51._52_4_ = -0.12420141;
      auVar51._56_4_ = -0.12420141;
      auVar51._60_4_ = -0.12420141;
      auVar104 = vfmadd213ps_avx512f(auVar52,auVar104,auVar51);
      local_2680 = auVar104._0_8_;
      local_1bc0 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1bb8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1bb0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1ba8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1ba0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1b98 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1b90 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1b88 = uStack_2648;
      local_1c00 = local_2480._0_8_;
      uStack_1bf8 = local_2480._8_8_;
      uStack_1bf0 = local_2480._16_8_;
      uStack_1be8 = local_2480._24_8_;
      uStack_1be0 = local_2480._32_8_;
      uStack_1bd8 = local_2480._40_8_;
      uStack_1bd0 = local_2480._48_8_;
      uStack_1bc8 = local_2480._56_8_;
      local_1c40[0] = 0.14249323;
      local_1c40[1] = 0.14249323;
      afStack_1c38[0] = 0.14249323;
      afStack_1c38[1] = 0.14249323;
      afStack_1c30[0] = 0.14249323;
      afStack_1c30[1] = 0.14249323;
      afStack_1c28[0] = 0.14249323;
      afStack_1c28[1] = 0.14249323;
      afStack_1c20[0] = 0.14249323;
      afStack_1c20[1] = 0.14249323;
      afStack_1c18[0] = 0.14249323;
      afStack_1c18[1] = 0.14249323;
      afStack_1c10[0] = 0.14249323;
      afStack_1c10[1] = 0.14249323;
      afStack_1c08[0] = 0.14249323;
      afStack_1c08[1] = 0.14249323;
      auVar50._16_8_ = local_2480._16_8_;
      auVar50._0_16_ = local_2480._0_16_;
      auVar50._24_8_ = local_2480._24_8_;
      auVar50._32_8_ = local_2480._32_8_;
      auVar50._40_8_ = local_2480._40_8_;
      auVar50._48_8_ = local_2480._48_8_;
      auVar50._56_8_ = local_2480._56_8_;
      auVar49._8_4_ = 0.14249323;
      auVar49._12_4_ = 0.14249323;
      auVar49._0_4_ = 0.14249323;
      auVar49._4_4_ = 0.14249323;
      auVar49._16_4_ = 0.14249323;
      auVar49._20_4_ = 0.14249323;
      auVar49._24_4_ = 0.14249323;
      auVar49._28_4_ = 0.14249323;
      auVar49._32_4_ = 0.14249323;
      auVar49._36_4_ = 0.14249323;
      auVar49._40_4_ = 0.14249323;
      auVar49._44_4_ = 0.14249323;
      auVar49._48_4_ = 0.14249323;
      auVar49._52_4_ = 0.14249323;
      auVar49._56_4_ = 0.14249323;
      auVar49._60_4_ = 0.14249323;
      auVar104 = vfmadd213ps_avx512f(auVar50,auVar104,auVar49);
      local_2680 = auVar104._0_8_;
      local_1c80 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1c78 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1c70 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1c68 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1c60 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1c58 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1c50 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1c48 = uStack_2648;
      local_1cc0 = local_2480._0_8_;
      uStack_1cb8 = local_2480._8_8_;
      uStack_1cb0 = local_2480._16_8_;
      uStack_1ca8 = local_2480._24_8_;
      uStack_1ca0 = local_2480._32_8_;
      uStack_1c98 = local_2480._40_8_;
      uStack_1c90 = local_2480._48_8_;
      uStack_1c88 = local_2480._56_8_;
      local_1d00[0] = -0.16668057;
      local_1d00[1] = -0.16668057;
      afStack_1cf8[0] = -0.16668057;
      afStack_1cf8[1] = -0.16668057;
      afStack_1cf0[0] = -0.16668057;
      afStack_1cf0[1] = -0.16668057;
      afStack_1ce8[0] = -0.16668057;
      afStack_1ce8[1] = -0.16668057;
      afStack_1ce0[0] = -0.16668057;
      afStack_1ce0[1] = -0.16668057;
      afStack_1cd8[0] = -0.16668057;
      afStack_1cd8[1] = -0.16668057;
      afStack_1cd0[0] = -0.16668057;
      afStack_1cd0[1] = -0.16668057;
      afStack_1cc8[0] = -0.16668057;
      afStack_1cc8[1] = -0.16668057;
      auVar48._16_8_ = local_2480._16_8_;
      auVar48._0_16_ = local_2480._0_16_;
      auVar48._24_8_ = local_2480._24_8_;
      auVar48._32_8_ = local_2480._32_8_;
      auVar48._40_8_ = local_2480._40_8_;
      auVar48._48_8_ = local_2480._48_8_;
      auVar48._56_8_ = local_2480._56_8_;
      auVar47._8_4_ = -0.16668057;
      auVar47._12_4_ = -0.16668057;
      auVar47._0_4_ = -0.16668057;
      auVar47._4_4_ = -0.16668057;
      auVar47._16_4_ = -0.16668057;
      auVar47._20_4_ = -0.16668057;
      auVar47._24_4_ = -0.16668057;
      auVar47._28_4_ = -0.16668057;
      auVar47._32_4_ = -0.16668057;
      auVar47._36_4_ = -0.16668057;
      auVar47._40_4_ = -0.16668057;
      auVar47._44_4_ = -0.16668057;
      auVar47._48_4_ = -0.16668057;
      auVar47._52_4_ = -0.16668057;
      auVar47._56_4_ = -0.16668057;
      auVar47._60_4_ = -0.16668057;
      auVar104 = vfmadd213ps_avx512f(auVar48,auVar104,auVar47);
      local_2680 = auVar104._0_8_;
      local_1d40 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1d38 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1d30 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1d28 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1d20 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1d18 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1d10 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1d08 = uStack_2648;
      local_1d80 = local_2480._0_8_;
      uStack_1d78 = local_2480._8_8_;
      uStack_1d70 = local_2480._16_8_;
      uStack_1d68 = local_2480._24_8_;
      uStack_1d60 = local_2480._32_8_;
      uStack_1d58 = local_2480._40_8_;
      uStack_1d50 = local_2480._48_8_;
      uStack_1d48 = local_2480._56_8_;
      local_1dc0[0] = 0.20000714;
      local_1dc0[1] = 0.20000714;
      afStack_1db8[0] = 0.20000714;
      afStack_1db8[1] = 0.20000714;
      afStack_1db0[0] = 0.20000714;
      afStack_1db0[1] = 0.20000714;
      afStack_1da8[0] = 0.20000714;
      afStack_1da8[1] = 0.20000714;
      afStack_1da0[0] = 0.20000714;
      afStack_1da0[1] = 0.20000714;
      afStack_1d98[0] = 0.20000714;
      afStack_1d98[1] = 0.20000714;
      afStack_1d90[0] = 0.20000714;
      afStack_1d90[1] = 0.20000714;
      afStack_1d88[0] = 0.20000714;
      afStack_1d88[1] = 0.20000714;
      auVar46._16_8_ = local_2480._16_8_;
      auVar46._0_16_ = local_2480._0_16_;
      auVar46._24_8_ = local_2480._24_8_;
      auVar46._32_8_ = local_2480._32_8_;
      auVar46._40_8_ = local_2480._40_8_;
      auVar46._48_8_ = local_2480._48_8_;
      auVar46._56_8_ = local_2480._56_8_;
      auVar45._8_4_ = 0.20000714;
      auVar45._12_4_ = 0.20000714;
      auVar45._0_4_ = 0.20000714;
      auVar45._4_4_ = 0.20000714;
      auVar45._16_4_ = 0.20000714;
      auVar45._20_4_ = 0.20000714;
      auVar45._24_4_ = 0.20000714;
      auVar45._28_4_ = 0.20000714;
      auVar45._32_4_ = 0.20000714;
      auVar45._36_4_ = 0.20000714;
      auVar45._40_4_ = 0.20000714;
      auVar45._44_4_ = 0.20000714;
      auVar45._48_4_ = 0.20000714;
      auVar45._52_4_ = 0.20000714;
      auVar45._56_4_ = 0.20000714;
      auVar45._60_4_ = 0.20000714;
      auVar104 = vfmadd213ps_avx512f(auVar46,auVar104,auVar45);
      local_2680 = auVar104._0_8_;
      local_1e00 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1df8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1df0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1de8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1de0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1dd8 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1dd0 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1dc8 = uStack_2648;
      local_1e40 = local_2480._0_8_;
      uStack_1e38 = local_2480._8_8_;
      uStack_1e30 = local_2480._16_8_;
      uStack_1e28 = local_2480._24_8_;
      uStack_1e20 = local_2480._32_8_;
      uStack_1e18 = local_2480._40_8_;
      uStack_1e10 = local_2480._48_8_;
      uStack_1e08 = local_2480._56_8_;
      local_1e80[0] = -0.24999994;
      local_1e80[1] = -0.24999994;
      afStack_1e78[0] = -0.24999994;
      afStack_1e78[1] = -0.24999994;
      afStack_1e70[0] = -0.24999994;
      afStack_1e70[1] = -0.24999994;
      afStack_1e68[0] = -0.24999994;
      afStack_1e68[1] = -0.24999994;
      afStack_1e60[0] = -0.24999994;
      afStack_1e60[1] = -0.24999994;
      afStack_1e58[0] = -0.24999994;
      afStack_1e58[1] = -0.24999994;
      afStack_1e50[0] = -0.24999994;
      afStack_1e50[1] = -0.24999994;
      afStack_1e48[0] = -0.24999994;
      afStack_1e48[1] = -0.24999994;
      auVar44._16_8_ = local_2480._16_8_;
      auVar44._0_16_ = local_2480._0_16_;
      auVar44._24_8_ = local_2480._24_8_;
      auVar44._32_8_ = local_2480._32_8_;
      auVar44._40_8_ = local_2480._40_8_;
      auVar44._48_8_ = local_2480._48_8_;
      auVar44._56_8_ = local_2480._56_8_;
      auVar43._8_4_ = -0.24999994;
      auVar43._12_4_ = -0.24999994;
      auVar43._0_4_ = -0.24999994;
      auVar43._4_4_ = -0.24999994;
      auVar43._16_4_ = -0.24999994;
      auVar43._20_4_ = -0.24999994;
      auVar43._24_4_ = -0.24999994;
      auVar43._28_4_ = -0.24999994;
      auVar43._32_4_ = -0.24999994;
      auVar43._36_4_ = -0.24999994;
      auVar43._40_4_ = -0.24999994;
      auVar43._44_4_ = -0.24999994;
      auVar43._48_4_ = -0.24999994;
      auVar43._52_4_ = -0.24999994;
      auVar43._56_4_ = -0.24999994;
      auVar43._60_4_ = -0.24999994;
      auVar104 = vfmadd213ps_avx512f(auVar44,auVar104,auVar43);
      local_2680 = auVar104._0_8_;
      local_1ec0 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1eb8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1eb0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1ea8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1ea0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1e98 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1e90 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1e88 = uStack_2648;
      local_1f00 = local_2480._0_8_;
      uStack_1ef8 = local_2480._8_8_;
      uStack_1ef0 = local_2480._16_8_;
      uStack_1ee8 = local_2480._24_8_;
      uStack_1ee0 = local_2480._32_8_;
      uStack_1ed8 = local_2480._40_8_;
      uStack_1ed0 = local_2480._48_8_;
      uStack_1ec8 = local_2480._56_8_;
      local_1f40[0] = 0.3333333;
      local_1f40[1] = 0.3333333;
      afStack_1f38[0] = 0.3333333;
      afStack_1f38[1] = 0.3333333;
      afStack_1f30[0] = 0.3333333;
      afStack_1f30[1] = 0.3333333;
      afStack_1f28[0] = 0.3333333;
      afStack_1f28[1] = 0.3333333;
      afStack_1f20[0] = 0.3333333;
      afStack_1f20[1] = 0.3333333;
      afStack_1f18[0] = 0.3333333;
      afStack_1f18[1] = 0.3333333;
      afStack_1f10[0] = 0.3333333;
      afStack_1f10[1] = 0.3333333;
      afStack_1f08[0] = 0.3333333;
      afStack_1f08[1] = 0.3333333;
      auVar42._16_8_ = local_2480._16_8_;
      auVar42._0_16_ = local_2480._0_16_;
      auVar42._24_8_ = local_2480._24_8_;
      auVar42._32_8_ = local_2480._32_8_;
      auVar42._40_8_ = local_2480._40_8_;
      auVar42._48_8_ = local_2480._48_8_;
      auVar42._56_8_ = local_2480._56_8_;
      auVar41._8_4_ = 0.3333333;
      auVar41._12_4_ = 0.3333333;
      auVar41._0_4_ = 0.3333333;
      auVar41._4_4_ = 0.3333333;
      auVar41._16_4_ = 0.3333333;
      auVar41._20_4_ = 0.3333333;
      auVar41._24_4_ = 0.3333333;
      auVar41._28_4_ = 0.3333333;
      auVar41._32_4_ = 0.3333333;
      auVar41._36_4_ = 0.3333333;
      auVar41._40_4_ = 0.3333333;
      auVar41._44_4_ = 0.3333333;
      auVar41._48_4_ = 0.3333333;
      auVar41._52_4_ = 0.3333333;
      auVar41._56_4_ = 0.3333333;
      auVar41._60_4_ = 0.3333333;
      auVar104 = vfmadd213ps_avx512f(auVar42,auVar104,auVar41);
      local_2680 = auVar104._0_8_;
      local_2200 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_21f8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_21f0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_21e8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_21e0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_21d8 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_21d0 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_21c8 = uStack_2648;
      local_2240 = local_2480._0_8_;
      uStack_2238 = local_2480._8_8_;
      uStack_2230 = local_2480._16_8_;
      uStack_2228 = local_2480._24_8_;
      uStack_2220 = local_2480._32_8_;
      uStack_2218 = local_2480._40_8_;
      uStack_2210 = local_2480._48_8_;
      uStack_2208 = local_2480._56_8_;
      auVar106._16_8_ = local_2480._16_8_;
      auVar106._0_16_ = local_2480._0_16_;
      auVar106._24_8_ = local_2480._24_8_;
      auVar106._32_8_ = local_2480._32_8_;
      auVar106._40_8_ = local_2480._40_8_;
      auVar106._48_8_ = local_2480._48_8_;
      auVar106._56_8_ = local_2480._56_8_;
      auVar104 = vmulps_avx512f(auVar104,auVar106);
      local_2680 = auVar104._0_8_;
      local_2280 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_2278 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_2270 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_2268 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_2260 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_2258 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_2250 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_2248 = uStack_2648;
      local_22c0 = local_2640._0_8_;
      uStack_22b8 = local_2640._8_8_;
      uStack_22b0 = local_2640._16_8_;
      uStack_22a8 = local_2640._24_8_;
      uStack_22a0 = local_2640._32_8_;
      uStack_2298 = local_2640._40_8_;
      uStack_2290 = local_2640._48_8_;
      uStack_2288 = local_2640._56_8_;
      auVar104 = vmulps_avx512f(auVar104,local_2640);
      local_1f80 = local_2580._0_8_;
      uStack_1f78 = local_2580._8_8_;
      uStack_2570 = auVar97._16_8_;
      uStack_1f70 = uStack_2570;
      uStack_2568 = auVar16._24_8_;
      uStack_1f68 = uStack_2568;
      uStack_2560 = auVar98._32_8_;
      uStack_1f60 = uStack_2560;
      uStack_2558 = auVar96._40_8_;
      uStack_1f58 = uStack_2558;
      uStack_2550 = auVar99._48_8_;
      uStack_1f50 = uStack_2550;
      uStack_2548 = auVar105._56_8_;
      uStack_1f48 = uStack_2548;
      local_1fc0[0] = -0.00021219444;
      local_1fc0[1] = -0.00021219444;
      afStack_1fb8[0] = -0.00021219444;
      afStack_1fb8[1] = -0.00021219444;
      afStack_1fb0[0] = -0.00021219444;
      afStack_1fb0[1] = -0.00021219444;
      afStack_1fa8[0] = -0.00021219444;
      afStack_1fa8[1] = -0.00021219444;
      afStack_1fa0[0] = -0.00021219444;
      afStack_1fa0[1] = -0.00021219444;
      afStack_1f98[0] = -0.00021219444;
      afStack_1f98[1] = -0.00021219444;
      afStack_1f90[0] = -0.00021219444;
      afStack_1f90[1] = -0.00021219444;
      afStack_1f88[0] = -0.00021219444;
      afStack_1f88[1] = -0.00021219444;
      local_2680 = auVar104._0_8_;
      local_2000 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_1ff8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_1ff0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_1fe8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_1fe0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1fd8 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1fd0 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1fc8 = uStack_2648;
      auVar40._16_8_ = uStack_2570;
      auVar40._0_16_ = local_2580;
      auVar40._24_8_ = uStack_2568;
      auVar40._32_8_ = uStack_2560;
      auVar40._40_8_ = uStack_2558;
      auVar40._48_8_ = uStack_2550;
      auVar40._56_8_ = uStack_2548;
      auVar39._8_4_ = -0.00021219444;
      auVar39._12_4_ = -0.00021219444;
      auVar39._0_4_ = -0.00021219444;
      auVar39._4_4_ = -0.00021219444;
      auVar39._16_4_ = -0.00021219444;
      auVar39._20_4_ = -0.00021219444;
      auVar39._24_4_ = -0.00021219444;
      auVar39._28_4_ = -0.00021219444;
      auVar39._32_4_ = -0.00021219444;
      auVar39._36_4_ = -0.00021219444;
      auVar39._40_4_ = -0.00021219444;
      auVar39._44_4_ = -0.00021219444;
      auVar39._48_4_ = -0.00021219444;
      auVar39._52_4_ = -0.00021219444;
      auVar39._56_4_ = -0.00021219444;
      auVar39._60_4_ = -0.00021219444;
      auVar104 = vfmadd213ps_avx512f(auVar39,auVar40,auVar104);
      local_1740 = local_2640._0_8_;
      uStack_1738 = local_2640._8_8_;
      uStack_1730 = local_2640._16_8_;
      uStack_1728 = local_2640._24_8_;
      uStack_1720 = local_2640._32_8_;
      uStack_1718 = local_2640._40_8_;
      uStack_1710 = local_2640._48_8_;
      uStack_1708 = local_2640._56_8_;
      local_1780[0] = 0.5;
      local_1780[1] = 0.5;
      afStack_1778[0] = 0.5;
      afStack_1778[1] = 0.5;
      afStack_1770[0] = 0.5;
      afStack_1770[1] = 0.5;
      afStack_1768[0] = 0.5;
      afStack_1768[1] = 0.5;
      afStack_1760[0] = 0.5;
      afStack_1760[1] = 0.5;
      afStack_1758[0] = 0.5;
      afStack_1758[1] = 0.5;
      afStack_1750[0] = 0.5;
      afStack_1750[1] = 0.5;
      afStack_1748[0] = 0.5;
      afStack_1748[1] = 0.5;
      local_2680 = auVar104._0_8_;
      local_17c0 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_17b8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_17b0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_17a8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_17a0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_1798 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_1790 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_1788 = uStack_2648;
      auVar59._8_4_ = 0.5;
      auVar59._12_4_ = 0.5;
      auVar59._0_4_ = 0.5;
      auVar59._4_4_ = 0.5;
      auVar59._16_4_ = 0.5;
      auVar59._20_4_ = 0.5;
      auVar59._24_4_ = 0.5;
      auVar59._28_4_ = 0.5;
      auVar59._32_4_ = 0.5;
      auVar59._36_4_ = 0.5;
      auVar59._40_4_ = 0.5;
      auVar59._44_4_ = 0.5;
      auVar59._48_4_ = 0.5;
      auVar59._52_4_ = 0.5;
      auVar59._56_4_ = 0.5;
      auVar59._60_4_ = 0.5;
      auVar104 = vfnmadd213ps_avx512f(auVar59,local_2640,auVar104);
      local_16c0 = local_2480._0_8_;
      uStack_16b8 = local_2480._8_8_;
      uStack_16b0 = local_2480._16_8_;
      uStack_16a8 = local_2480._24_8_;
      uStack_16a0 = local_2480._32_8_;
      uStack_1698 = local_2480._40_8_;
      uStack_1690 = local_2480._48_8_;
      uStack_1688 = local_2480._56_8_;
      local_2680 = auVar104._0_8_;
      local_1700 = local_2680;
      uStack_2678 = auVar104._8_8_;
      uStack_16f8 = uStack_2678;
      uStack_2670 = auVar104._16_8_;
      uStack_16f0 = uStack_2670;
      uStack_2668 = auVar104._24_8_;
      uStack_16e8 = uStack_2668;
      uStack_2660 = auVar104._32_8_;
      uStack_16e0 = uStack_2660;
      uStack_2658 = auVar104._40_8_;
      uStack_16d8 = uStack_2658;
      uStack_2650 = auVar104._48_8_;
      uStack_16d0 = uStack_2650;
      uStack_2648 = auVar104._56_8_;
      uStack_16c8 = uStack_2648;
      auVar60._16_8_ = local_2480._16_8_;
      auVar60._0_16_ = local_2480._0_16_;
      auVar60._24_8_ = local_2480._24_8_;
      auVar60._32_8_ = local_2480._32_8_;
      auVar60._40_8_ = local_2480._40_8_;
      auVar60._48_8_ = local_2480._48_8_;
      auVar60._56_8_ = local_2480._56_8_;
      auVar104 = vaddps_avx512f(auVar60,auVar104);
      local_2040 = local_2580._0_8_;
      uStack_2038 = local_2580._8_8_;
      uStack_2030 = uStack_2570;
      uStack_2028 = uStack_2568;
      uStack_2020 = uStack_2560;
      uStack_2018 = uStack_2558;
      uStack_2010 = uStack_2550;
      uStack_2008 = uStack_2548;
      local_2080[0] = 0.6933594;
      local_2080[1] = 0.6933594;
      afStack_2078[0] = 0.6933594;
      afStack_2078[1] = 0.6933594;
      afStack_2070[0] = 0.6933594;
      afStack_2070[1] = 0.6933594;
      afStack_2068[0] = 0.6933594;
      afStack_2068[1] = 0.6933594;
      afStack_2060[0] = 0.6933594;
      afStack_2060[1] = 0.6933594;
      afStack_2058[0] = 0.6933594;
      afStack_2058[1] = 0.6933594;
      afStack_2050[0] = 0.6933594;
      afStack_2050[1] = 0.6933594;
      afStack_2048[0] = 0.6933594;
      afStack_2048[1] = 0.6933594;
      local_2480._0_8_ = auVar104._0_8_;
      local_20c0 = local_2480._0_8_;
      local_2480._8_8_ = auVar104._8_8_;
      uStack_20b8 = local_2480._8_8_;
      local_2480._16_8_ = auVar104._16_8_;
      uStack_20b0 = local_2480._16_8_;
      local_2480._24_8_ = auVar104._24_8_;
      uStack_20a8 = local_2480._24_8_;
      local_2480._32_8_ = auVar104._32_8_;
      uStack_20a0 = local_2480._32_8_;
      local_2480._40_8_ = auVar104._40_8_;
      uStack_2098 = local_2480._40_8_;
      local_2480._48_8_ = auVar104._48_8_;
      uStack_2090 = local_2480._48_8_;
      local_2480._56_8_ = auVar104._56_8_;
      uStack_2088 = local_2480._56_8_;
      auVar38._16_8_ = uStack_2570;
      auVar38._0_16_ = local_2580;
      auVar38._24_8_ = uStack_2568;
      auVar38._32_8_ = uStack_2560;
      auVar38._40_8_ = uStack_2558;
      auVar38._48_8_ = uStack_2550;
      auVar38._56_8_ = uStack_2548;
      auVar37._8_4_ = 0.6933594;
      auVar37._12_4_ = 0.6933594;
      auVar37._0_4_ = 0.6933594;
      auVar37._4_4_ = 0.6933594;
      auVar37._16_4_ = 0.6933594;
      auVar37._20_4_ = 0.6933594;
      auVar37._24_4_ = 0.6933594;
      auVar37._28_4_ = 0.6933594;
      auVar37._32_4_ = 0.6933594;
      auVar37._36_4_ = 0.6933594;
      auVar37._40_4_ = 0.6933594;
      auVar37._44_4_ = 0.6933594;
      auVar37._48_4_ = 0.6933594;
      auVar37._52_4_ = 0.6933594;
      auVar37._56_4_ = 0.6933594;
      auVar37._60_4_ = 0.6933594;
      local_2480 = vfmadd213ps_avx512f(auVar37,auVar38,auVar104);
      local_1500 = local_2480._0_8_;
      uStack_14f8 = local_2480._8_8_;
      uStack_14f0 = local_2480._16_8_;
      uStack_14e8 = local_2480._24_8_;
      uStack_14e0 = local_2480._32_8_;
      uStack_14d8 = local_2480._40_8_;
      uStack_14d0 = local_2480._48_8_;
      uStack_14c8 = local_2480._56_8_;
      auVar104 = vpmovm2d_avx512dq(CONCAT62((int6)((ulong)local_26c0 >> 0x10),local_2502) &
                                   0xffffffff);
      local_2440 = vmovdqa64_avx512f(auVar104);
      local_1540 = vmovdqa64_avx512f(local_2440);
      _local_2680 = vpord_avx512f(local_2480,local_1540);
      local_2900 = local_2680;
      uStack_28f8 = uStack_2678;
      uStack_28f0 = uStack_2670;
      uStack_28e8 = uStack_2668;
      uStack_28e0 = uStack_2660;
      uStack_28d8 = uStack_2658;
      uStack_28d0 = uStack_2650;
      uStack_28c8 = uStack_2648;
      local_2790 = local_2870;
      local_2800 = local_2680;
      uStack_27f8 = uStack_2678;
      uStack_27f0 = uStack_2670;
      uStack_27e8 = uStack_2668;
      uStack_27e0 = uStack_2660;
      uStack_27d8 = uStack_2658;
      uStack_27d0 = uStack_2650;
      uStack_27c8 = uStack_2648;
      *local_2870 = _local_2680;
      local_2870 = local_2870 + 1;
      _local_2580 = auVar105;
      local_2180 = local_21c0;
      uStack_2178 = uStack_21b8;
      uStack_2170 = uStack_21b0;
      uStack_2168 = uStack_21a8;
      uStack_2160 = uStack_21a0;
      uStack_2158 = uStack_2198;
      uStack_2150 = uStack_2190;
      uStack_2148 = uStack_2188;
      local_1882 = local_2582;
      local_1880 = local_1900;
      uStack_1878 = uStack_18f8;
      uStack_1870 = uStack_18f0;
      uStack_1868 = uStack_18e8;
      uStack_1860 = uStack_18e0;
      uStack_1858 = uStack_18d8;
      uStack_1850 = uStack_18d0;
      uStack_1848 = uStack_18c8;
      local_12c2 = local_2582;
      local_12c0 = local_1340;
      uStack_12b8 = uStack_1338;
      uStack_12b0 = uStack_1330;
      uStack_12a8 = uStack_1328;
      uStack_12a0 = uStack_1320;
      uStack_1298 = uStack_1318;
      uStack_1290 = uStack_1310;
      uStack_1288 = uStack_1308;
      local_11c2 = local_2502;
    }
    for (; local_28bc + 7 < local_2864; local_28bc = local_28bc + 8) {
      local_2788 = local_2870;
      uStack_e50 = *(undefined8 *)(*local_2870 + 0x10);
      uStack_e48 = *(undefined8 *)(*local_2870 + 0x18);
      local_26a8 = local_2849;
      local_26b0 = &local_2920;
      local_1100 = 0x3f800000;
      uStack_10fc = 0x3f800000;
      uStack_10f8 = 0x3f800000;
      uStack_10f4 = 0x3f800000;
      uStack_10f0 = 0x3f800000;
      uStack_10ec = 0x3f800000;
      uStack_10e8 = 0x3f800000;
      uStack_10e4 = 0x3f800000;
      local_f60 = 0;
      uStack_f58 = 0;
      uStack_f50 = 0;
      uStack_f48 = 0;
      local_1120 = vcmpps_avx(*(undefined1 (*) [32])*local_2870,ZEXT1632(ZEXT816(0)),2);
      local_10c0 = SUB168(*(undefined1 (*) [16])*local_2870,0);
      local_e60 = local_10c0;
      uStack_10b8 = SUB168(*(undefined1 (*) [16])*local_2870,8);
      uStack_e58 = uStack_10b8;
      local_e80 = 0x800000;
      uStack_e7c = 0x800000;
      uStack_e78 = 0x800000;
      uStack_e74 = 0x800000;
      uStack_e70 = 0x800000;
      uStack_e6c = 0x800000;
      uStack_e68 = 0x800000;
      uStack_e64 = 0x800000;
      auVar64._8_4_ = 0x800000;
      auVar64._0_8_ = 0x80000000800000;
      auVar64._12_4_ = 0x800000;
      auVar64._16_4_ = 0x800000;
      auVar64._20_4_ = 0x800000;
      auVar64._24_4_ = 0x800000;
      auVar64._28_4_ = 0x800000;
      auVar16 = vmaxps_avx(*(undefined1 (*) [32])*local_2870,auVar64);
      local_10c0 = auVar16._0_8_;
      local_800 = local_10c0;
      uStack_10b8 = auVar16._8_8_;
      uStack_7f8 = uStack_10b8;
      uStack_10b0 = auVar16._16_8_;
      uStack_7f0 = uStack_10b0;
      uStack_10a8 = auVar16._24_8_;
      uStack_7e8 = uStack_10a8;
      local_820 = local_10c0;
      uStack_818 = uStack_10b8;
      uStack_810 = uStack_10b0;
      uStack_808 = uStack_10a8;
      local_824 = 0x17;
      local_6e0 = local_10c0;
      uStack_6d8 = uStack_10b8;
      uStack_6d0 = uStack_10b0;
      uStack_6c8 = uStack_10a8;
      local_6e4 = 0x17;
      auVar20 = vpsrld_avx2(auVar16,ZEXT416(0x17));
      local_1000 = local_10c0;
      uStack_ff8 = uStack_10b8;
      uStack_ff0 = uStack_10b0;
      uStack_fe8 = uStack_10a8;
      local_1020 = 0x807fffff;
      uStack_101c = 0x807fffff;
      uStack_1018 = 0x807fffff;
      uStack_1014 = 0x807fffff;
      uStack_1010 = 0x807fffff;
      uStack_100c = 0x807fffff;
      uStack_1008 = 0x807fffff;
      uStack_1004 = 0x807fffff;
      auVar63._8_4_ = 0x807fffff;
      auVar63._0_8_ = 0x807fffff807fffff;
      auVar63._12_4_ = 0x807fffff;
      auVar63._16_4_ = 0x807fffff;
      auVar63._20_4_ = 0x807fffff;
      auVar63._24_4_ = 0x807fffff;
      auVar63._28_4_ = 0x807fffff;
      auVar16 = vpand_avx2(auVar16,auVar63);
      local_10c0 = auVar16._0_8_;
      local_780 = local_10c0;
      uStack_10b8 = auVar16._8_8_;
      uStack_778 = uStack_10b8;
      uStack_10b0 = auVar16._16_8_;
      uStack_770 = uStack_10b0;
      uStack_10a8 = auVar16._24_8_;
      uStack_768 = uStack_10a8;
      local_7a0 = 0x3f000000;
      uStack_79c = 0x3f000000;
      uStack_798 = 0x3f000000;
      uStack_794 = 0x3f000000;
      uStack_790 = 0x3f000000;
      uStack_78c = 0x3f000000;
      uStack_788 = 0x3f000000;
      uStack_784 = 0x3f000000;
      auVar76._8_4_ = 0x3f000000;
      auVar76._0_8_ = 0x3f0000003f000000;
      auVar76._12_4_ = 0x3f000000;
      auVar76._16_4_ = 0x3f000000;
      auVar76._20_4_ = 0x3f000000;
      auVar76._24_4_ = 0x3f000000;
      auVar76._28_4_ = 0x3f000000;
      auVar19 = vpor_avx2(auVar16,auVar76);
      local_10e0._0_8_ = auVar20._0_8_;
      local_740 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar20._8_8_;
      uStack_738 = local_10e0._8_8_;
      local_10e0._16_8_ = auVar20._16_8_;
      uStack_730 = local_10e0._16_8_;
      local_10e0._24_8_ = auVar20._24_8_;
      uStack_728 = local_10e0._24_8_;
      local_760 = 0x7f0000007f;
      uStack_758 = 0x7f0000007f;
      uStack_750 = 0x7f0000007f;
      uStack_748 = 0x7f0000007f;
      local_6a0 = local_10e0._0_8_;
      uStack_698 = local_10e0._8_8_;
      uStack_690 = local_10e0._16_8_;
      uStack_688 = local_10e0._24_8_;
      local_6c0 = 0x7f0000007f;
      uStack_6b8 = 0x7f0000007f;
      uStack_6b0 = 0x7f0000007f;
      uStack_6a8 = 0x7f0000007f;
      auVar77._8_8_ = 0x7f0000007f;
      auVar77._0_8_ = 0x7f0000007f;
      auVar77._16_8_ = 0x7f0000007f;
      auVar77._24_8_ = 0x7f0000007f;
      local_10e0 = vpsubd_avx2(auVar20,auVar77);
      local_720 = local_10e0._0_8_;
      uStack_718 = local_10e0._8_8_;
      uStack_710 = local_10e0._16_8_;
      uStack_708 = local_10e0._24_8_;
      auVar16 = vcvtdq2ps_avx(local_10e0);
      local_1140 = auVar16._0_8_;
      uVar21 = local_1140;
      uStack_1138 = auVar16._8_8_;
      uVar23 = uStack_1138;
      uStack_1130 = auVar16._16_8_;
      uVar24 = uStack_1130;
      uStack_1128 = auVar16._24_8_;
      uVar25 = uStack_1128;
      local_ca0 = 0x3f8000003f800000;
      uStack_c98 = 0x3f8000003f800000;
      uStack_c90 = 0x3f8000003f800000;
      uStack_c88 = 0x3f8000003f800000;
      local_c80._0_4_ = auVar16._0_4_;
      local_c80._4_4_ = auVar16._4_4_;
      uStack_c78._0_4_ = auVar16._8_4_;
      uStack_c78._4_4_ = auVar16._12_4_;
      uStack_c70._0_4_ = auVar16._16_4_;
      uStack_c70._4_4_ = auVar16._20_4_;
      uStack_c68._0_4_ = auVar16._24_4_;
      uStack_c68._4_4_ = auVar16._28_4_;
      local_1140._4_4_ = local_c80._4_4_ + 1.0;
      local_1140._0_4_ = (float)local_c80 + 1.0;
      uStack_1138._0_4_ = (float)uStack_c78 + 1.0;
      uStack_1138._4_4_ = uStack_c78._4_4_ + 1.0;
      uStack_1130._0_4_ = (float)uStack_c70 + 1.0;
      uStack_1130._4_4_ = uStack_c70._4_4_ + 1.0;
      auVar97 = _local_1140;
      uStack_1128._0_4_ = (float)uStack_c68 + 1.0;
      uStack_1128._4_4_ = uStack_c68._4_4_ + 1.0;
      auVar20 = _local_1140;
      auVar109._8_4_ = 0x3f3504f3;
      auVar109._0_8_ = 0x3f3504f33f3504f3;
      auVar109._12_4_ = 0x3f3504f3;
      auVar109._16_4_ = 0x3f3504f3;
      auVar109._20_4_ = 0x3f3504f3;
      auVar109._24_4_ = 0x3f3504f3;
      auVar109._28_4_ = 0x3f3504f3;
      local_1160 = vcmpps_avx(auVar19,auVar109,1);
      local_10c0 = auVar19._0_8_;
      local_1040 = local_10c0;
      uStack_10b8 = auVar19._8_8_;
      uStack_1038 = uStack_10b8;
      uStack_10b0 = auVar19._16_8_;
      uStack_1030 = uStack_10b0;
      uStack_10a8 = auVar19._24_8_;
      uStack_1028 = uStack_10a8;
      local_1060 = local_1160._0_8_;
      uStack_1058 = local_1160._8_8_;
      uStack_1050 = local_1160._16_8_;
      uStack_1048 = local_1160._24_8_;
      local_1180 = vpand_avx2(auVar19,local_1160);
      local_f80 = local_10c0;
      uStack_f78 = uStack_10b8;
      uStack_f70 = uStack_10b0;
      uStack_f68 = uStack_10a8;
      local_fa0 = 0x3f8000003f800000;
      uStack_f98 = 0x3f8000003f800000;
      uStack_f90 = 0x3f8000003f800000;
      uStack_f88 = 0x3f8000003f800000;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._16_8_ = 0x3f8000003f800000;
      auVar16._24_8_ = 0x3f8000003f800000;
      auVar16 = vsubps_avx(auVar19,auVar16);
      local_fc0 = local_1140;
      uStack_fb8 = uStack_1138;
      uStack_1130 = auVar97._16_8_;
      uStack_fb0 = uStack_1130;
      uStack_1128 = auVar20._24_8_;
      uStack_fa8 = uStack_1128;
      local_1080 = 0x3f8000003f800000;
      uStack_1078 = 0x3f8000003f800000;
      uStack_1070 = 0x3f8000003f800000;
      uStack_1068 = 0x3f8000003f800000;
      local_10a0 = local_1160._0_8_;
      uStack_1098 = local_1160._8_8_;
      uStack_1090 = local_1160._16_8_;
      uStack_1088 = local_1160._24_8_;
      auVar19._8_8_ = 0x3f8000003f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._16_8_ = 0x3f8000003f800000;
      auVar19._24_8_ = 0x3f8000003f800000;
      local_fe0 = vpand_avx2(auVar19,local_1160);
      auVar20._16_8_ = uStack_1130;
      auVar20._0_16_ = _local_1140;
      auVar20._24_8_ = uStack_1128;
      _local_1140 = vsubps_avx(auVar20,local_fe0);
      local_10c0 = auVar16._0_8_;
      uVar26 = local_10c0;
      uStack_10b8 = auVar16._8_8_;
      uVar27 = uStack_10b8;
      uStack_10b0 = auVar16._16_8_;
      uVar28 = uStack_10b0;
      uStack_10a8 = auVar16._24_8_;
      uVar29 = uStack_10a8;
      local_cc0._0_4_ = auVar16._0_4_;
      local_cc0._4_4_ = auVar16._4_4_;
      uStack_cb8._0_4_ = auVar16._8_4_;
      uStack_cb8._4_4_ = auVar16._12_4_;
      uStack_cb0._0_4_ = auVar16._16_4_;
      uStack_cb0._4_4_ = auVar16._20_4_;
      uStack_ca8._0_4_ = auVar16._24_4_;
      uStack_ca8._4_4_ = auVar16._28_4_;
      local_ce0._0_4_ = local_1180._0_4_;
      local_ce0._4_4_ = local_1180._4_4_;
      uStack_cd8._0_4_ = local_1180._8_4_;
      uStack_cd8._4_4_ = local_1180._12_4_;
      uStack_cd0._0_4_ = local_1180._16_4_;
      uStack_cd0._4_4_ = local_1180._20_4_;
      uStack_cc8._0_4_ = local_1180._24_4_;
      uStack_cc8._4_4_ = local_1180._28_4_;
      local_10c0._0_4_ = (float)local_cc0 + (float)local_ce0;
      local_10c0._4_4_ = local_cc0._4_4_ + local_ce0._4_4_;
      uStack_cb8._0_4_ = (float)uStack_cb8 + (float)uStack_cd8;
      uStack_cb8._4_4_ = uStack_cb8._4_4_ + uStack_cd8._4_4_;
      uStack_cb0._0_4_ = (float)uStack_cb0 + (float)uStack_cd0;
      uStack_cb0._4_4_ = uStack_cb0._4_4_ + uStack_cd0._4_4_;
      uStack_ca8._0_4_ = (float)uStack_ca8 + (float)uStack_cc8;
      fStack_1184 = uStack_ca8._4_4_ + uStack_cc8._4_4_;
      uStack_10b8._0_4_ = (float)uStack_cb8;
      uStack_10b8._4_4_ = uStack_cb8._4_4_;
      uStack_10b0._0_4_ = (float)uStack_cb0;
      uStack_10b0._4_4_ = uStack_cb0._4_4_;
      auVar97 = _local_10c0;
      uStack_10a8._0_4_ = (float)uStack_ca8;
      uStack_10a8._4_4_ = fStack_1184;
      auVar19 = _local_10c0;
      local_ec0 = local_10c0;
      uStack_eb8 = uStack_10b8;
      uStack_10b0 = auVar97._16_8_;
      uStack_eb0 = uStack_10b0;
      uStack_10a8 = auVar19._24_8_;
      uStack_ea8 = uStack_10a8;
      local_11a0 = (float)local_10c0._0_4_ * (float)local_10c0._0_4_;
      fStack_119c = (float)local_10c0._4_4_ * (float)local_10c0._4_4_;
      fStack_1198 = (float)uStack_cb8 * (float)uStack_cb8;
      fStack_1194 = uStack_cb8._4_4_ * uStack_cb8._4_4_;
      fStack_1190 = (float)uStack_cb0 * (float)uStack_cb0;
      fStack_118c = uStack_cb0._4_4_ * uStack_cb0._4_4_;
      fStack_1188 = (float)uStack_ca8 * (float)uStack_ca8;
      uStack_11b8._0_4_ = 0x3d9021bb;
      local_11c0 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_11b8._4_4_ = 0x3d9021bb;
      uStack_11b0._0_4_ = 0x3d9021bb;
      uStack_11b0._4_4_ = 0x3d9021bb;
      auVar97 = _local_11c0;
      uStack_11a8._0_4_ = 0.070376836;
      uStack_11a8._4_4_ = 0x3d9021bb;
      auVar16 = _local_11c0;
      local_e10 = local_11c0;
      local_df0 = local_10c0;
      local_d50 = ::_ps256_cephes_log_p1;
      local_c20 = 0x3d9021bb3d9021bb;
      uStack_c18 = uStack_11b8;
      uStack_11b0 = auVar97._16_8_;
      uStack_c10 = uStack_11b0;
      uStack_11a8 = auVar16._24_8_;
      uStack_c08 = uStack_11a8;
      local_c40 = local_10c0;
      uStack_c38 = uStack_10b8;
      uStack_c30 = uStack_10b0;
      uStack_c28 = uStack_10a8;
      local_c60[0] = -0.1151461;
      local_c60[1] = -0.1151461;
      afStack_c58[0] = -0.1151461;
      afStack_c58[1] = -0.1151461;
      afStack_c50[0] = -0.1151461;
      afStack_c50[1] = -0.1151461;
      afStack_c48[0] = -0.1151461;
      afStack_c48[1] = -0.1151461;
      auVar65._8_4_ = -0.1151461;
      auVar65._12_4_ = -0.1151461;
      auVar65._0_4_ = -0.1151461;
      auVar65._4_4_ = -0.1151461;
      auVar65._16_4_ = -0.1151461;
      auVar65._20_4_ = -0.1151461;
      auVar65._24_4_ = -0.1151461;
      auVar65._28_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(auVar19,auVar16,auVar65);
      local_d68 = ::_ps256_cephes_log_p2;
      local_11c0 = auVar22._0_8_;
      local_bc0 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_bb8 = uStack_11b8;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_be0 = local_10c0;
      uStack_bd8 = uStack_10b8;
      uStack_bd0 = uStack_10b0;
      uStack_bc8 = uStack_10a8;
      local_c00[0] = 0.116769984;
      local_c00[1] = 0.116769984;
      afStack_bf8[0] = 0.116769984;
      afStack_bf8[1] = 0.116769984;
      afStack_bf0[0] = 0.116769984;
      afStack_bf0[1] = 0.116769984;
      afStack_be8[0] = 0.116769984;
      afStack_be8[1] = 0.116769984;
      auVar66._8_4_ = 0.116769984;
      auVar66._12_4_ = 0.116769984;
      auVar66._0_4_ = 0.116769984;
      auVar66._4_4_ = 0.116769984;
      auVar66._16_4_ = 0.116769984;
      auVar66._20_4_ = 0.116769984;
      auVar66._24_4_ = 0.116769984;
      auVar66._28_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar22),auVar66);
      local_d80 = ::_ps256_cephes_log_p3;
      local_11c0 = auVar22._0_8_;
      local_b60 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_b58 = uStack_11b8;
      uStack_b50 = 0;
      uStack_b48 = 0;
      local_b80 = local_10c0;
      uStack_b78 = uStack_10b8;
      uStack_b70 = uStack_10b0;
      uStack_b68 = uStack_10a8;
      local_ba0[0] = -0.12420141;
      local_ba0[1] = -0.12420141;
      afStack_b98[0] = -0.12420141;
      afStack_b98[1] = -0.12420141;
      afStack_b90[0] = -0.12420141;
      afStack_b90[1] = -0.12420141;
      afStack_b88[0] = -0.12420141;
      afStack_b88[1] = -0.12420141;
      auVar67._8_4_ = -0.12420141;
      auVar67._12_4_ = -0.12420141;
      auVar67._0_4_ = -0.12420141;
      auVar67._4_4_ = -0.12420141;
      auVar67._16_4_ = -0.12420141;
      auVar67._20_4_ = -0.12420141;
      auVar67._24_4_ = -0.12420141;
      auVar67._28_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar22),auVar67);
      local_d98 = ::_ps256_cephes_log_p4;
      local_11c0 = auVar22._0_8_;
      local_b00 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_af8 = uStack_11b8;
      uStack_af0 = 0;
      uStack_ae8 = 0;
      local_b20 = local_10c0;
      uStack_b18 = uStack_10b8;
      uStack_b10 = uStack_10b0;
      uStack_b08 = uStack_10a8;
      local_b40[0] = 0.14249323;
      local_b40[1] = 0.14249323;
      afStack_b38[0] = 0.14249323;
      afStack_b38[1] = 0.14249323;
      afStack_b30[0] = 0.14249323;
      afStack_b30[1] = 0.14249323;
      afStack_b28[0] = 0.14249323;
      afStack_b28[1] = 0.14249323;
      auVar68._8_4_ = 0.14249323;
      auVar68._12_4_ = 0.14249323;
      auVar68._0_4_ = 0.14249323;
      auVar68._4_4_ = 0.14249323;
      auVar68._16_4_ = 0.14249323;
      auVar68._20_4_ = 0.14249323;
      auVar68._24_4_ = 0.14249323;
      auVar68._28_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar22),auVar68);
      local_db0 = ::_ps256_cephes_log_p5;
      local_11c0 = auVar22._0_8_;
      local_aa0 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_a98 = uStack_11b8;
      uStack_a90 = 0;
      uStack_a88 = 0;
      local_ac0 = local_10c0;
      uStack_ab8 = uStack_10b8;
      uStack_ab0 = uStack_10b0;
      uStack_aa8 = uStack_10a8;
      local_ae0[0] = -0.16668057;
      local_ae0[1] = -0.16668057;
      afStack_ad8[0] = -0.16668057;
      afStack_ad8[1] = -0.16668057;
      afStack_ad0[0] = -0.16668057;
      afStack_ad0[1] = -0.16668057;
      afStack_ac8[0] = -0.16668057;
      afStack_ac8[1] = -0.16668057;
      auVar69._8_4_ = -0.16668057;
      auVar69._12_4_ = -0.16668057;
      auVar69._0_4_ = -0.16668057;
      auVar69._4_4_ = -0.16668057;
      auVar69._16_4_ = -0.16668057;
      auVar69._20_4_ = -0.16668057;
      auVar69._24_4_ = -0.16668057;
      auVar69._28_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar22),auVar69);
      local_dc8 = ::_ps256_cephes_log_p6;
      local_11c0 = auVar22._0_8_;
      local_a40 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_a38 = uStack_11b8;
      uStack_a30 = 0;
      uStack_a28 = 0;
      local_a60 = local_10c0;
      uStack_a58 = uStack_10b8;
      uStack_a50 = uStack_10b0;
      uStack_a48 = uStack_10a8;
      local_a80[0] = 0.20000714;
      local_a80[1] = 0.20000714;
      afStack_a78[0] = 0.20000714;
      afStack_a78[1] = 0.20000714;
      afStack_a70[0] = 0.20000714;
      afStack_a70[1] = 0.20000714;
      afStack_a68[0] = 0.20000714;
      afStack_a68[1] = 0.20000714;
      auVar70._8_4_ = 0.20000714;
      auVar70._12_4_ = 0.20000714;
      auVar70._0_4_ = 0.20000714;
      auVar70._4_4_ = 0.20000714;
      auVar70._16_4_ = 0.20000714;
      auVar70._20_4_ = 0.20000714;
      auVar70._24_4_ = 0.20000714;
      auVar70._28_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar22),auVar70);
      local_de0 = ::_ps256_cephes_log_p7;
      local_11c0 = auVar22._0_8_;
      local_9e0 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_9d8 = uStack_11b8;
      uStack_9d0 = 0;
      uStack_9c8 = 0;
      local_a00 = local_10c0;
      uStack_9f8 = uStack_10b8;
      uStack_9f0 = uStack_10b0;
      uStack_9e8 = uStack_10a8;
      local_a20[0] = -0.24999994;
      local_a20[1] = -0.24999994;
      afStack_a18[0] = -0.24999994;
      afStack_a18[1] = -0.24999994;
      afStack_a10[0] = -0.24999994;
      afStack_a10[1] = -0.24999994;
      afStack_a08[0] = -0.24999994;
      afStack_a08[1] = -0.24999994;
      auVar71._8_4_ = -0.24999994;
      auVar71._12_4_ = -0.24999994;
      auVar71._0_4_ = -0.24999994;
      auVar71._4_4_ = -0.24999994;
      auVar71._16_4_ = -0.24999994;
      auVar71._20_4_ = -0.24999994;
      auVar71._24_4_ = -0.24999994;
      auVar71._28_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar22),auVar71);
      local_df8 = ::_ps256_cephes_log_p8;
      local_11c0 = auVar22._0_8_;
      local_980 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_978 = uStack_11b8;
      uStack_970 = 0;
      uStack_968 = 0;
      local_9a0 = local_10c0;
      uStack_998 = uStack_10b8;
      uStack_990 = uStack_10b0;
      uStack_988 = uStack_10a8;
      local_9c0[0] = 0.3333333;
      local_9c0[1] = 0.3333333;
      afStack_9b8[0] = 0.3333333;
      afStack_9b8[1] = 0.3333333;
      afStack_9b0[0] = 0.3333333;
      afStack_9b0[1] = 0.3333333;
      afStack_9a8[0] = 0.3333333;
      afStack_9a8[1] = 0.3333333;
      auVar72._8_4_ = 0.3333333;
      auVar72._12_4_ = 0.3333333;
      auVar72._0_4_ = 0.3333333;
      auVar72._4_4_ = 0.3333333;
      auVar72._16_4_ = 0.3333333;
      auVar72._20_4_ = 0.3333333;
      auVar72._24_4_ = 0.3333333;
      auVar72._28_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar22),auVar72);
      local_11c0 = auVar22._0_8_;
      uVar30 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uVar31 = uStack_11b8;
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_f00 = local_10c0;
      uStack_ef8 = uStack_10b8;
      uStack_ef0 = uStack_10b0;
      uStack_ee8 = uStack_10a8;
      local_ee0._0_4_ = auVar22._0_4_;
      local_ee0._4_4_ = auVar22._4_4_;
      uStack_ed8._0_4_ = auVar22._8_4_;
      uStack_ed8._4_4_ = auVar22._12_4_;
      local_11c0._4_4_ = local_ee0._4_4_ * (float)local_10c0._4_4_;
      local_11c0._0_4_ = (float)local_ee0 * (float)local_10c0._0_4_;
      uStack_11b8._0_4_ = (float)uStack_ed8 * (float)uStack_cb8;
      uStack_11b8._4_4_ = uStack_ed8._4_4_ * uStack_cb8._4_4_;
      uStack_11b0._0_4_ = (float)uStack_cb0 * 0.0;
      uStack_11b0._4_4_ = uStack_cb0._4_4_ * 0.0;
      auVar97 = _local_11c0;
      local_f20 = local_11c0;
      uStack_f18 = uStack_11b8;
      uStack_11b0 = auVar97._16_8_;
      uStack_f10 = uStack_11b0;
      uStack_11a8 = (ulong)(uint)((float)uStack_ca8 * 0.0);
      uStack_f08 = uStack_11a8;
      local_f40 = CONCAT44(fStack_119c,local_11a0);
      uStack_f38 = CONCAT44(fStack_1194,fStack_1198);
      uStack_f30 = CONCAT44(fStack_118c,fStack_1190);
      uStack_f28 = CONCAT44(fStack_1184,fStack_1188);
      uStack_11a8._0_4_ = (float)uStack_ca8 * 0.0 * fStack_1188;
      local_11c0._4_4_ = local_ee0._4_4_ * (float)local_10c0._4_4_ * fStack_119c;
      local_11c0._0_4_ = (float)local_ee0 * (float)local_10c0._0_4_ * local_11a0;
      uStack_11b8._0_4_ = (float)uStack_ed8 * (float)uStack_cb8 * fStack_1198;
      uStack_11b8._4_4_ = uStack_ed8._4_4_ * uStack_cb8._4_4_ * fStack_1194;
      uStack_11b0._0_4_ = (float)uStack_cb0 * 0.0 * fStack_1190;
      uStack_11b0._4_4_ = uStack_cb0._4_4_ * 0.0 * fStack_118c;
      auVar97 = _local_11c0;
      uStack_11a8._4_4_ = 0;
      auVar16 = _local_11c0;
      local_e00 = local_1140;
      local_e08 = ::_ps256_cephes_log_q1;
      local_920 = local_1140;
      uStack_918 = uStack_1138;
      uStack_910 = uStack_1130;
      uStack_908 = uStack_1128;
      local_940[0] = -0.00021219444;
      local_940[1] = -0.00021219444;
      afStack_938[0] = -0.00021219444;
      afStack_938[1] = -0.00021219444;
      afStack_930[0] = -0.00021219444;
      afStack_930[1] = -0.00021219444;
      afStack_928[0] = -0.00021219444;
      afStack_928[1] = -0.00021219444;
      local_960 = local_11c0;
      uStack_958 = uStack_11b8;
      uStack_11b0 = auVar97._16_8_;
      uStack_950 = uStack_11b0;
      uStack_11a8 = (ulong)(uint)(float)uStack_11a8;
      uStack_948 = uStack_11a8;
      auVar73._8_4_ = -0.00021219444;
      auVar73._12_4_ = -0.00021219444;
      auVar73._0_4_ = -0.00021219444;
      auVar73._4_4_ = -0.00021219444;
      auVar73._16_4_ = -0.00021219444;
      auVar73._20_4_ = -0.00021219444;
      auVar73._24_4_ = -0.00021219444;
      auVar73._28_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar73,_local_1140,auVar16);
      local_d28 = &local_11a0;
      local_d30 = ::_ps256_0p5;
      local_860 = CONCAT44(fStack_119c,local_11a0);
      uStack_858 = CONCAT44(fStack_1194,fStack_1198);
      uStack_850 = CONCAT44(fStack_118c,fStack_1190);
      uStack_848 = CONCAT44(fStack_1184,fStack_1188);
      auVar94._4_4_ = fStack_119c;
      auVar94._0_4_ = local_11a0;
      auVar94._8_4_ = fStack_1198;
      auVar94._12_4_ = fStack_1194;
      auVar94._16_4_ = fStack_1190;
      auVar94._20_4_ = fStack_118c;
      auVar94._24_4_ = fStack_1188;
      auVar94._28_4_ = fStack_1184;
      local_880[0] = 0.5;
      local_880[1] = 0.5;
      afStack_878[0] = 0.5;
      afStack_878[1] = 0.5;
      afStack_870[0] = 0.5;
      afStack_870[1] = 0.5;
      afStack_868[0] = 0.5;
      afStack_868[1] = 0.5;
      local_11c0 = auVar22._0_8_;
      local_8a0 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uStack_898 = uStack_11b8;
      uStack_890 = 0;
      uStack_888 = 0;
      auVar110._8_4_ = 0x80000000;
      auVar110._0_8_ = 0x8000000080000000;
      auVar110._12_4_ = 0x80000000;
      auVar110._16_4_ = 0x80000000;
      auVar110._20_4_ = 0x80000000;
      auVar110._24_4_ = 0x80000000;
      auVar110._28_4_ = 0x80000000;
      auVar75._8_4_ = 0.5;
      auVar75._12_4_ = 0.5;
      auVar75._0_4_ = 0.5;
      auVar75._4_4_ = 0.5;
      auVar75._16_4_ = 0.5;
      auVar75._20_4_ = 0.5;
      auVar75._24_4_ = 0.5;
      auVar75._28_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(auVar75,auVar94 ^ auVar110,ZEXT1632(auVar22));
      local_d00 = local_10c0;
      uStack_cf8 = uStack_10b8;
      uStack_cf0 = uStack_10b0;
      uStack_ce8 = uStack_10a8;
      local_11c0 = auVar22._0_8_;
      uVar32 = local_11c0;
      uStack_11b8 = auVar22._8_8_;
      uVar33 = uStack_11b8;
      uStack_d10 = 0;
      uStack_d08 = 0;
      local_d20._0_4_ = auVar22._0_4_;
      local_d20._4_4_ = auVar22._4_4_;
      uStack_d18._0_4_ = auVar22._8_4_;
      uStack_d18._4_4_ = auVar22._12_4_;
      local_10c0._4_4_ = (float)local_10c0._4_4_ + local_d20._4_4_;
      local_10c0._0_4_ = (float)local_10c0._0_4_ + (float)local_d20;
      uStack_10b8._0_4_ = (float)uStack_cb8 + (float)uStack_d18;
      uStack_10b8._4_4_ = uStack_cb8._4_4_ + uStack_d18._4_4_;
      uStack_10b0._0_4_ = (float)uStack_cb0 + 0.0;
      uStack_10b0._4_4_ = uStack_cb0._4_4_ + 0.0;
      auVar97 = _local_10c0;
      uStack_10a8._0_4_ = (float)uStack_ca8 + 0.0;
      uStack_10a8._4_4_ = fStack_1184 + 0.0;
      auVar16 = _local_10c0;
      local_e18 = local_1140;
      local_e20 = ::_ps256_cephes_log_q2;
      local_e28 = local_10c0;
      local_8c0 = local_1140;
      uStack_8b8 = uStack_1138;
      uStack_8b0 = uStack_1130;
      uStack_8a8 = uStack_1128;
      local_8e0[0] = 0.6933594;
      local_8e0[1] = 0.6933594;
      afStack_8d8[0] = 0.6933594;
      afStack_8d8[1] = 0.6933594;
      afStack_8d0[0] = 0.6933594;
      afStack_8d0[1] = 0.6933594;
      afStack_8c8[0] = 0.6933594;
      afStack_8c8[1] = 0.6933594;
      local_900 = local_10c0;
      uStack_8f8 = uStack_10b8;
      uStack_10b0 = auVar97._16_8_;
      uStack_8f0 = uStack_10b0;
      uStack_10a8 = auVar16._24_8_;
      uStack_8e8 = uStack_10a8;
      auVar74._8_4_ = 0.6933594;
      auVar74._12_4_ = 0.6933594;
      auVar74._0_4_ = 0.6933594;
      auVar74._4_4_ = 0.6933594;
      auVar74._16_4_ = 0.6933594;
      auVar74._20_4_ = 0.6933594;
      auVar74._24_4_ = 0.6933594;
      auVar74._28_4_ = 0.6933594;
      auVar22 = vfmadd213ps_fma(auVar74,_local_1140,auVar16);
      local_10c0 = auVar22._0_8_;
      local_7c0 = local_10c0;
      uStack_10b8 = auVar22._8_8_;
      uStack_7b8 = uStack_10b8;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0 = local_1120._0_8_;
      uStack_7d8 = local_1120._8_8_;
      uStack_7d0 = local_1120._16_8_;
      uStack_7c8 = local_1120._24_8_;
      _local_11c0 = vpor_avx2(ZEXT1632(auVar22),local_1120);
      local_2920 = local_11c0;
      uStack_2918 = uStack_11b8;
      uStack_2910 = uStack_11b0;
      uStack_2908 = uStack_11a8;
      local_2760 = local_2870;
      local_2780 = local_11c0;
      uStack_2778 = uStack_11b8;
      uStack_2770 = uStack_11b0;
      uStack_2768 = uStack_11a8;
      *(undefined1 (*) [32])*local_2870 = _local_11c0;
      local_2870 = (undefined1 (*) [64])(*local_2870 + 0x20);
      _local_10c0 = ZEXT1632(auVar22);
      local_ee0 = uVar30;
      uStack_ed8 = uVar31;
      local_ea0 = local_ec0;
      uStack_e98 = uStack_eb8;
      uStack_e90 = uStack_eb0;
      uStack_e88 = uStack_ea8;
      local_de8 = local_e10;
      local_dd8 = local_df0;
      local_dd0 = local_e10;
      local_dc0 = local_df0;
      local_db8 = local_e10;
      local_da8 = local_df0;
      local_da0 = local_e10;
      local_d90 = local_df0;
      local_d88 = local_e10;
      local_d78 = local_df0;
      local_d70 = local_e10;
      local_d60 = local_df0;
      local_d58 = local_e10;
      local_d48 = local_df0;
      local_d40 = local_e10;
      local_d38 = local_e10;
      local_d20 = uVar32;
      uStack_d18 = uVar33;
      local_ce0 = local_1180._0_8_;
      uStack_cd8 = local_1180._8_8_;
      uStack_cd0 = local_1180._16_8_;
      uStack_cc8 = local_1180._24_8_;
      local_cc0 = uVar26;
      uStack_cb8 = uVar27;
      uStack_cb0 = uVar28;
      uStack_ca8 = uVar29;
      local_c80 = uVar21;
      uStack_c78 = uVar23;
      uStack_c70 = uVar24;
      uStack_c68 = uVar25;
    }
    for (; local_26e8 = local_2810, local_2898 = local_2738, local_28bc + 3 < local_2864;
        local_28bc = local_28bc + 4) {
      local_2758 = local_2870;
      local_4c0 = *(undefined8 *)*local_2870;
      uStack_4b8 = *(undefined8 *)(*local_2870 + 8);
      local_2698 = local_2849;
      local_26a0 = &local_2930;
      local_610 = 0x3f800000;
      uStack_60c = 0x3f800000;
      uStack_608 = 0x3f800000;
      uStack_604 = 0x3f800000;
      local_540 = (undefined1  [16])0x0;
      local_120 = 0;
      uStack_118 = 0;
      local_620 = vcmpps_avx(*(undefined1 (*) [16])*local_2870,ZEXT816(0),2);
      local_4d0 = 0x800000;
      uStack_4cc = 0x800000;
      uStack_4c8 = 0x800000;
      uStack_4c4 = 0x800000;
      auVar79._8_4_ = 0x800000;
      auVar79._0_8_ = 0x80000000800000;
      auVar79._12_4_ = 0x800000;
      auVar22 = vmaxps_avx(*(undefined1 (*) [16])*local_2870,auVar79);
      local_5f0 = auVar22._0_8_;
      local_e0 = local_5f0;
      uStack_5e8 = auVar22._8_8_;
      uStack_d8 = uStack_5e8;
      local_f0 = local_5f0;
      uStack_e8 = uStack_5e8;
      local_f4 = 0x17;
      auVar18 = vpsrld_avx(auVar22,ZEXT416(0x17));
      local_590 = local_5f0;
      uStack_588 = uStack_5e8;
      local_5a0 = 0x807fffff;
      uStack_59c = 0x807fffff;
      uStack_598 = 0x807fffff;
      uStack_594 = 0x807fffff;
      auVar78._8_4_ = 0x807fffff;
      auVar78._0_8_ = 0x807fffff807fffff;
      auVar78._12_4_ = 0x807fffff;
      auVar22 = vpand_avx(auVar22,auVar78);
      local_5f0 = auVar22._0_8_;
      local_a0 = local_5f0;
      uStack_5e8 = auVar22._8_8_;
      uStack_98 = uStack_5e8;
      local_b0 = 0x3f000000;
      uStack_ac = 0x3f000000;
      uStack_a8 = 0x3f000000;
      uStack_a4 = 0x3f000000;
      auVar91._8_4_ = 0x3f000000;
      auVar91._0_8_ = 0x3f0000003f000000;
      auVar91._12_4_ = 0x3f000000;
      auVar17 = vpor_avx(auVar22,auVar91);
      local_600._0_8_ = auVar18._0_8_;
      local_80 = local_600._0_8_;
      local_600._8_8_ = auVar18._8_8_;
      uStack_78 = local_600._8_8_;
      local_90 = 0x7f0000007f;
      uStack_88 = 0x7f0000007f;
      auVar92._8_8_ = 0x7f0000007f;
      auVar92._0_8_ = 0x7f0000007f;
      local_600 = vpsubd_avx(auVar18,auVar92);
      local_450 = local_600._0_8_;
      uStack_448 = local_600._8_8_;
      auVar22 = vcvtdq2ps_avx(local_600);
      local_630 = auVar22._0_8_;
      uVar21 = local_630;
      uStack_628 = auVar22._8_8_;
      uVar23 = uStack_628;
      local_470 = 0x3f8000003f800000;
      uStack_468 = 0x3f8000003f800000;
      local_460._0_4_ = auVar22._0_4_;
      local_460._4_4_ = auVar22._4_4_;
      uStack_458._0_4_ = auVar22._8_4_;
      uStack_458._4_4_ = auVar22._12_4_;
      local_630._4_4_ = local_460._4_4_ + 1.0;
      local_630._0_4_ = (float)local_460 + 1.0;
      uStack_628._0_4_ = (float)uStack_458 + 1.0;
      uStack_628._4_4_ = uStack_458._4_4_ + 1.0;
      local_5f0 = auVar17._0_8_;
      local_60 = local_5f0;
      uStack_5e8 = auVar17._8_8_;
      uStack_58 = uStack_5e8;
      local_70 = 0x3f3504f3;
      uStack_6c = 0x3f3504f3;
      uStack_68 = 0x3f3504f3;
      uStack_64 = 0x3f3504f3;
      auVar93._8_4_ = 0x3f3504f3;
      auVar93._0_8_ = 0x3f3504f33f3504f3;
      auVar93._12_4_ = 0x3f3504f3;
      local_640 = vcmpps_avx(auVar17,auVar93,1);
      local_5b0 = local_5f0;
      uStack_5a8 = uStack_5e8;
      local_5c0 = local_640._0_8_;
      uStack_5b8 = local_640._8_8_;
      local_650 = vpand_avx(auVar17,local_640);
      local_550 = local_5f0;
      uStack_548 = uStack_5e8;
      local_560 = 0x3f8000003f800000;
      uStack_558 = 0x3f8000003f800000;
      auVar22._8_8_ = 0x3f8000003f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar22 = vsubps_avx(auVar17,auVar22);
      local_570 = local_630;
      uStack_568 = uStack_628;
      local_5d0 = 0x3f8000003f800000;
      uStack_5c8 = 0x3f8000003f800000;
      local_5e0 = local_640._0_8_;
      uStack_5d8 = local_640._8_8_;
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      local_580 = vpand_avx(auVar17,local_640);
      auVar18._8_8_ = uStack_628;
      auVar18._0_8_ = local_630;
      _local_630 = vsubps_avx(auVar18,local_580);
      local_5f0 = auVar22._0_8_;
      uVar24 = local_5f0;
      uStack_5e8 = auVar22._8_8_;
      uVar25 = uStack_5e8;
      local_480._0_4_ = auVar22._0_4_;
      local_480._4_4_ = auVar22._4_4_;
      uStack_478._0_4_ = auVar22._8_4_;
      uStack_478._4_4_ = auVar22._12_4_;
      local_490._0_4_ = local_650._0_4_;
      local_490._4_4_ = local_650._4_4_;
      uStack_488._0_4_ = local_650._8_4_;
      uStack_488._4_4_ = local_650._12_4_;
      local_5f0._0_4_ = (float)local_480 + (float)local_490;
      local_5f0._4_4_ = local_480._4_4_ + local_490._4_4_;
      uStack_478._0_4_ = (float)uStack_478 + (float)uStack_488;
      uStack_478._4_4_ = uStack_478._4_4_ + uStack_488._4_4_;
      uStack_5e8._0_4_ = (float)uStack_478;
      uStack_5e8._4_4_ = uStack_478._4_4_;
      local_4f0 = local_5f0;
      uStack_4e8 = uStack_5e8;
      local_660 = (float)local_5f0._0_4_ * (float)local_5f0._0_4_;
      fStack_65c = (float)local_5f0._4_4_ * (float)local_5f0._4_4_;
      fStack_658 = (float)uStack_478 * (float)uStack_478;
      fStack_654 = uStack_478._4_4_ * uStack_478._4_4_;
      uStack_668._0_4_ = 0x3d9021bb;
      local_670 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_668._4_4_ = 0x3d9021bb;
      local_438 = local_670;
      local_3e8 = local_5f0;
      local_348 = ::_ps_cephes_log_p1;
      local_2e0 = 0x3d9021bb3d9021bb;
      uStack_2d8 = uStack_668;
      local_2f0 = local_5f0;
      uStack_2e8 = uStack_5e8;
      local_300[0] = -0.1151461;
      local_300[1] = -0.1151461;
      afStack_2f8[0] = -0.1151461;
      afStack_2f8[1] = -0.1151461;
      auVar81._8_4_ = -0.1151461;
      auVar81._12_4_ = -0.1151461;
      auVar81._0_4_ = -0.1151461;
      auVar81._4_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(_local_5f0,_local_670,auVar81);
      local_360 = ::_ps_cephes_log_p2;
      local_670 = auVar22._0_8_;
      local_2b0 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_2a8 = uStack_668;
      local_2c0 = local_5f0;
      uStack_2b8 = uStack_5e8;
      local_2d0[0] = 0.116769984;
      local_2d0[1] = 0.116769984;
      afStack_2c8[0] = 0.116769984;
      afStack_2c8[1] = 0.116769984;
      auVar82._8_4_ = 0.116769984;
      auVar82._12_4_ = 0.116769984;
      auVar82._0_4_ = 0.116769984;
      auVar82._4_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(_local_5f0,auVar22,auVar82);
      local_378 = ::_ps_cephes_log_p3;
      local_670 = auVar22._0_8_;
      local_280 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_278 = uStack_668;
      local_290 = local_5f0;
      uStack_288 = uStack_5e8;
      local_2a0[0] = -0.12420141;
      local_2a0[1] = -0.12420141;
      afStack_298[0] = -0.12420141;
      afStack_298[1] = -0.12420141;
      auVar83._8_4_ = -0.12420141;
      auVar83._12_4_ = -0.12420141;
      auVar83._0_4_ = -0.12420141;
      auVar83._4_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(_local_5f0,auVar22,auVar83);
      local_390 = ::_ps_cephes_log_p4;
      local_670 = auVar22._0_8_;
      local_250 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_248 = uStack_668;
      local_260 = local_5f0;
      uStack_258 = uStack_5e8;
      local_270[0] = 0.14249323;
      local_270[1] = 0.14249323;
      afStack_268[0] = 0.14249323;
      afStack_268[1] = 0.14249323;
      auVar84._8_4_ = 0.14249323;
      auVar84._12_4_ = 0.14249323;
      auVar84._0_4_ = 0.14249323;
      auVar84._4_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(_local_5f0,auVar22,auVar84);
      local_3a8 = ::_ps_cephes_log_p5;
      local_670 = auVar22._0_8_;
      local_220 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_218 = uStack_668;
      local_230 = local_5f0;
      uStack_228 = uStack_5e8;
      local_240[0] = -0.16668057;
      local_240[1] = -0.16668057;
      afStack_238[0] = -0.16668057;
      afStack_238[1] = -0.16668057;
      auVar85._8_4_ = -0.16668057;
      auVar85._12_4_ = -0.16668057;
      auVar85._0_4_ = -0.16668057;
      auVar85._4_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(_local_5f0,auVar22,auVar85);
      local_3c0 = ::_ps_cephes_log_p6;
      local_670 = auVar22._0_8_;
      local_1f0 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_1e8 = uStack_668;
      local_200 = local_5f0;
      uStack_1f8 = uStack_5e8;
      local_210[0] = 0.20000714;
      local_210[1] = 0.20000714;
      afStack_208[0] = 0.20000714;
      afStack_208[1] = 0.20000714;
      auVar86._8_4_ = 0.20000714;
      auVar86._12_4_ = 0.20000714;
      auVar86._0_4_ = 0.20000714;
      auVar86._4_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(_local_5f0,auVar22,auVar86);
      local_3d8 = ::_ps_cephes_log_p7;
      local_670 = auVar22._0_8_;
      local_1c0 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_1b8 = uStack_668;
      local_1d0 = local_5f0;
      uStack_1c8 = uStack_5e8;
      local_1e0[0] = -0.24999994;
      local_1e0[1] = -0.24999994;
      afStack_1d8[0] = -0.24999994;
      afStack_1d8[1] = -0.24999994;
      auVar87._8_4_ = -0.24999994;
      auVar87._12_4_ = -0.24999994;
      auVar87._0_4_ = -0.24999994;
      auVar87._4_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(_local_5f0,auVar22,auVar87);
      local_3f0 = ::_ps_cephes_log_p8;
      local_670 = auVar22._0_8_;
      local_190 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_188 = uStack_668;
      local_1a0 = local_5f0;
      uStack_198 = uStack_5e8;
      local_1b0[0] = 0.3333333;
      local_1b0[1] = 0.3333333;
      afStack_1a8[0] = 0.3333333;
      afStack_1a8[1] = 0.3333333;
      auVar88._8_4_ = 0.3333333;
      auVar88._12_4_ = 0.3333333;
      auVar88._0_4_ = 0.3333333;
      auVar88._4_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(_local_5f0,auVar22,auVar88);
      local_670 = auVar22._0_8_;
      uVar26 = local_670;
      uStack_668 = auVar22._8_8_;
      uVar27 = uStack_668;
      local_510 = local_5f0;
      uStack_508 = uStack_5e8;
      local_500._0_4_ = auVar22._0_4_;
      local_500._4_4_ = auVar22._4_4_;
      uStack_4f8._0_4_ = auVar22._8_4_;
      uStack_4f8._4_4_ = auVar22._12_4_;
      local_670._4_4_ = local_500._4_4_ * (float)local_5f0._4_4_;
      local_670._0_4_ = (float)local_500 * (float)local_5f0._0_4_;
      uStack_668._0_4_ = (float)uStack_4f8 * (float)uStack_478;
      uStack_668._4_4_ = uStack_4f8._4_4_ * uStack_478._4_4_;
      local_520 = local_670;
      uStack_518 = uStack_668;
      local_530 = CONCAT44(fStack_65c,local_660);
      uStack_528 = CONCAT44(fStack_654,fStack_658);
      local_670._4_4_ = local_500._4_4_ * (float)local_5f0._4_4_ * fStack_65c;
      local_670._0_4_ = (float)local_500 * (float)local_5f0._0_4_ * local_660;
      uStack_668._0_4_ = (float)uStack_4f8 * (float)uStack_478 * fStack_658;
      uStack_668._4_4_ = uStack_4f8._4_4_ * uStack_478._4_4_ * fStack_654;
      local_3f8 = local_630;
      local_400 = ::_ps_cephes_log_q1;
      local_160 = local_630;
      uStack_158 = uStack_628;
      local_170[0] = -0.00021219444;
      local_170[1] = -0.00021219444;
      afStack_168[0] = -0.00021219444;
      afStack_168[1] = -0.00021219444;
      local_180 = local_670;
      uStack_178 = uStack_668;
      auVar89._8_4_ = -0.00021219444;
      auVar89._12_4_ = -0.00021219444;
      auVar89._0_4_ = -0.00021219444;
      auVar89._4_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar89,_local_630,_local_670);
      local_428 = &local_660;
      local_430 = ::_ps_0p5;
      local_310 = CONCAT44(fStack_65c,local_660);
      uStack_308 = CONCAT44(fStack_654,fStack_658);
      auVar95._4_4_ = fStack_65c;
      auVar95._0_4_ = local_660;
      auVar95._8_4_ = fStack_658;
      auVar95._12_4_ = fStack_654;
      local_320[0] = 0.5;
      local_320[1] = 0.5;
      afStack_318[0] = 0.5;
      afStack_318[1] = 0.5;
      local_670 = auVar22._0_8_;
      local_330 = local_670;
      uStack_668 = auVar22._8_8_;
      uStack_328 = uStack_668;
      auVar108._8_4_ = 0x80000000;
      auVar108._0_8_ = 0x8000000080000000;
      auVar108._12_4_ = 0x80000000;
      auVar80._8_4_ = 0.5;
      auVar80._12_4_ = 0.5;
      auVar80._0_4_ = 0.5;
      auVar80._4_4_ = 0.5;
      _local_670 = vfmadd213ps_fma(auVar80,auVar95 ^ auVar108,auVar22);
      local_4a0 = local_5f0;
      uStack_498 = uStack_5e8;
      local_4b0._0_4_ = local_670._0_4_;
      local_4b0._4_4_ = local_670._4_4_;
      uStack_4a8._0_4_ = local_670._8_4_;
      uStack_4a8._4_4_ = local_670._12_4_;
      local_5f0._4_4_ = (float)local_5f0._4_4_ + local_4b0._4_4_;
      local_5f0._0_4_ = (float)local_5f0._0_4_ + (float)local_4b0;
      uStack_5e8._0_4_ = (float)uStack_478 + (float)uStack_4a8;
      uStack_5e8._4_4_ = uStack_478._4_4_ + uStack_4a8._4_4_;
      local_410 = local_630;
      local_418 = ::_ps_cephes_log_q2;
      local_420 = local_5f0;
      local_130 = local_630;
      uStack_128 = uStack_628;
      local_140[0] = 0.6933594;
      local_140[1] = 0.6933594;
      afStack_138[0] = 0.6933594;
      afStack_138[1] = 0.6933594;
      local_150 = local_5f0;
      uStack_148 = uStack_5e8;
      auVar90._8_4_ = 0.6933594;
      auVar90._12_4_ = 0.6933594;
      auVar90._0_4_ = 0.6933594;
      auVar90._4_4_ = 0.6933594;
      auVar22 = vfmadd213ps_fma(auVar90,_local_630,_local_5f0);
      local_5f0 = auVar22._0_8_;
      local_c0 = local_5f0;
      uStack_5e8 = auVar22._8_8_;
      uStack_b8 = uStack_5e8;
      local_d0 = local_620._0_8_;
      uStack_c8 = local_620._8_8_;
      _local_5f0 = vpor_avx(auVar22,local_620);
      local_2930 = local_5f0;
      uStack_2928 = uStack_5e8;
      local_2740 = local_2870;
      local_2750 = local_5f0;
      uStack_2748 = uStack_5e8;
      *(undefined1 (*) [16])*local_2870 = _local_5f0;
      local_2870 = (undefined1 (*) [64])(*local_2870 + 0x10);
      local_500 = uVar26;
      uStack_4f8 = uVar27;
      local_4e0 = local_4f0;
      uStack_4d8 = uStack_4e8;
      local_4b0 = local_670;
      uStack_4a8 = uStack_668;
      local_490 = local_650._0_8_;
      uStack_488 = local_650._8_8_;
      local_480 = uVar24;
      uStack_478 = uVar25;
      local_460 = uVar21;
      uStack_458 = uVar23;
      local_408 = local_438;
      local_3e0 = local_438;
      local_3d0 = local_3e8;
      local_3c8 = local_438;
      local_3b8 = local_3e8;
      local_3b0 = local_438;
      local_3a0 = local_3e8;
      local_398 = local_438;
      local_388 = local_3e8;
      local_380 = local_438;
      local_370 = local_3e8;
      local_368 = local_438;
      local_358 = local_3e8;
      local_350 = local_438;
      local_340 = local_3e8;
      local_338 = local_438;
      local_110 = local_4c0;
      uStack_108 = uStack_4b8;
    }
    for (; local_28bc < local_2864; local_28bc = local_28bc + 1) {
      local_2688 = local_2849;
      local_2690 = local_2870;
      fVar107 = logf(*(float *)*local_2870);
      *(float *)*local_2870 = fVar107;
      local_2870 = (undefined1 (*) [64])(*local_2870 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}